

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::sse2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  Primitive *pPVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  int iVar44;
  undefined4 uVar45;
  StackEntry *pSVar48;
  ulong extraout_RAX;
  uint uVar46;
  undefined4 uVar47;
  RTCRayN *pRVar49;
  long extraout_RAX_00;
  long lVar50;
  int iVar51;
  __int_type_conflict _Var52;
  __int_type_conflict _Var53;
  __int_type_conflict extraout_RDX;
  __int_type_conflict extraout_RDX_00;
  __int_type_conflict extraout_RDX_01;
  __int_type_conflict extraout_RDX_02;
  byte bVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  __int_type_conflict _Var59;
  bool bVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  float fVar65;
  uint uVar66;
  float fVar67;
  undefined8 uVar68;
  float fVar114;
  __m128 a_1;
  float fVar111;
  uint uVar112;
  uint uVar115;
  uint uVar117;
  undefined1 auVar69 [16];
  undefined2 uVar110;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar113;
  float fVar116;
  float fVar118;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar109;
  short sVar119;
  float fVar120;
  float fVar157;
  float fVar158;
  vfloat_impl<4> t;
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar159;
  float fVar160;
  float fVar168;
  float fVar170;
  vfloat4 a;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar169;
  float fVar171;
  float fVar172;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar173;
  float fVar192;
  float fVar193;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar194;
  float fVar202;
  float fVar203;
  vfloat4 v;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar204;
  float fVar218;
  float fVar219;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar223;
  float fVar224;
  float fVar244;
  float fVar246;
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar245;
  float fVar247;
  float fVar248;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar249;
  float fVar253;
  float fVar254;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar268;
  float fVar274;
  undefined1 auVar262 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar266;
  uint uVar285;
  undefined1 auVar267 [16];
  float fVar286;
  float fVar287;
  uint uVar288;
  float fVar296;
  float fVar299;
  undefined1 auVar289 [16];
  float fVar297;
  float fVar300;
  float fVar302;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  uint uVar298;
  uint uVar301;
  uint uVar303;
  undefined1 auVar295 [16];
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar322 [16];
  float fVar334;
  float fVar345;
  float fVar349;
  undefined1 auVar337 [16];
  float fVar352;
  undefined1 auVar340 [16];
  float fVar335;
  float fVar336;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar350;
  float fVar351;
  float fVar353;
  float fVar354;
  float fVar355;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar356;
  float fVar360;
  float fVar361;
  float fVar362;
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar366 [16];
  undefined1 auVar368 [16];
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  uint uVar379;
  float fVar380;
  undefined1 auVar373 [16];
  float fVar381;
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  uint local_6bc;
  undefined8 local_678;
  undefined1 local_658 [8];
  float fStack_650;
  float fStack_64c;
  undefined1 local_648 [8];
  float fStack_640;
  float fStack_63c;
  undefined1 local_638 [8];
  float fStack_630;
  float fStack_62c;
  undefined1 local_628 [16];
  undefined1 local_5e8 [16];
  __int_type_conflict local_5d0;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_598;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  Vec3fa dir;
  RTCFilterFunctionNArguments args;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  uint local_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  BBox<embree::vfloat_impl<4>_> tp1;
  float local_1e8;
  float fStack_1e4;
  BBox<embree::vfloat_impl<4>_> tp0;
  float local_118 [4];
  float local_108 [4];
  StackEntry stack [4];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 uVar156;
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar365 [16];
  undefined1 auVar367 [16];
  undefined1 auVar372 [16];
  
  PVar8 = prim[1];
  uVar56 = (ulong)(byte)PVar8;
  pPVar5 = prim + uVar56 * 0x19 + 6;
  fVar193 = *(float *)(pPVar5 + 0xc);
  uVar47 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar194 = (*(float *)(ray + k * 4) - *(float *)pPVar5) * fVar193;
  fVar202 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar5 + 4)) * fVar193;
  fVar203 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar5 + 8)) * fVar193;
  fVar173 = *(float *)(ray + k * 4 + 0x40) * fVar193;
  fVar192 = *(float *)(ray + k * 4 + 0x50) * fVar193;
  fVar193 = *(float *)(ray + k * 4 + 0x60) * fVar193;
  uVar45 = *(undefined4 *)(prim + uVar56 * 4 + 6);
  uVar156 = (undefined1)((uint)uVar45 >> 0x18);
  uVar110 = CONCAT11(uVar156,uVar156);
  uVar156 = (undefined1)((uint)uVar45 >> 0x10);
  uVar68 = CONCAT35(CONCAT21(uVar110,uVar156),CONCAT14(uVar156,uVar45));
  uVar156 = (undefined1)((uint)uVar45 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar68 >> 0x20),uVar156),uVar156);
  sVar119 = CONCAT11((char)uVar45,(char)uVar45);
  uVar55 = CONCAT62(uVar28,sVar119);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar55;
  auVar123._12_2_ = uVar110;
  auVar123._14_2_ = uVar110;
  uVar110 = (undefined2)((ulong)uVar68 >> 0x20);
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._8_2_ = 0;
  auVar122._0_8_ = uVar55;
  auVar122._10_2_ = uVar110;
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._8_2_ = uVar110;
  auVar121._0_8_ = uVar55;
  uVar110 = (undefined2)uVar28;
  auVar29._4_8_ = auVar121._8_8_;
  auVar29._2_2_ = uVar110;
  auVar29._0_2_ = uVar110;
  fVar159 = (float)((int)sVar119 >> 8);
  fVar168 = (float)(auVar29._0_4_ >> 0x18);
  fVar170 = (float)(auVar121._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar56 * 5 + 6);
  uVar156 = (undefined1)((uint)uVar45 >> 0x18);
  uVar110 = CONCAT11(uVar156,uVar156);
  uVar156 = (undefined1)((uint)uVar45 >> 0x10);
  uVar68 = CONCAT35(CONCAT21(uVar110,uVar156),CONCAT14(uVar156,uVar45));
  uVar156 = (undefined1)((uint)uVar45 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar68 >> 0x20),uVar156),uVar156);
  sVar119 = CONCAT11((char)uVar45,(char)uVar45);
  uVar55 = CONCAT62(uVar28,sVar119);
  auVar126._8_4_ = 0;
  auVar126._0_8_ = uVar55;
  auVar126._12_2_ = uVar110;
  auVar126._14_2_ = uVar110;
  uVar110 = (undefined2)((ulong)uVar68 >> 0x20);
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._8_2_ = 0;
  auVar125._0_8_ = uVar55;
  auVar125._10_2_ = uVar110;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._8_2_ = uVar110;
  auVar124._0_8_ = uVar55;
  uVar110 = (undefined2)uVar28;
  auVar30._4_8_ = auVar124._8_8_;
  auVar30._2_2_ = uVar110;
  auVar30._0_2_ = uVar110;
  fVar204 = (float)((int)sVar119 >> 8);
  fVar218 = (float)(auVar30._0_4_ >> 0x18);
  fVar219 = (float)(auVar124._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar56 * 6 + 6);
  uVar156 = (undefined1)((uint)uVar45 >> 0x18);
  uVar110 = CONCAT11(uVar156,uVar156);
  uVar156 = (undefined1)((uint)uVar45 >> 0x10);
  uVar68 = CONCAT35(CONCAT21(uVar110,uVar156),CONCAT14(uVar156,uVar45));
  uVar156 = (undefined1)((uint)uVar45 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar68 >> 0x20),uVar156),uVar156);
  sVar119 = CONCAT11((char)uVar45,(char)uVar45);
  uVar55 = CONCAT62(uVar28,sVar119);
  auVar129._8_4_ = 0;
  auVar129._0_8_ = uVar55;
  auVar129._12_2_ = uVar110;
  auVar129._14_2_ = uVar110;
  uVar110 = (undefined2)((ulong)uVar68 >> 0x20);
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._8_2_ = 0;
  auVar128._0_8_ = uVar55;
  auVar128._10_2_ = uVar110;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._8_2_ = uVar110;
  auVar127._0_8_ = uVar55;
  uVar110 = (undefined2)uVar28;
  auVar31._4_8_ = auVar127._8_8_;
  auVar31._2_2_ = uVar110;
  auVar31._0_2_ = uVar110;
  fVar255 = (float)((int)sVar119 >> 8);
  fVar268 = (float)(auVar31._0_4_ >> 0x18);
  fVar274 = (float)(auVar127._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar56 * 0xb + 6);
  uVar156 = (undefined1)((uint)uVar45 >> 0x18);
  uVar110 = CONCAT11(uVar156,uVar156);
  uVar156 = (undefined1)((uint)uVar45 >> 0x10);
  uVar68 = CONCAT35(CONCAT21(uVar110,uVar156),CONCAT14(uVar156,uVar45));
  uVar156 = (undefined1)((uint)uVar45 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar68 >> 0x20),uVar156),uVar156);
  sVar119 = CONCAT11((char)uVar45,(char)uVar45);
  uVar55 = CONCAT62(uVar28,sVar119);
  auVar132._8_4_ = 0;
  auVar132._0_8_ = uVar55;
  auVar132._12_2_ = uVar110;
  auVar132._14_2_ = uVar110;
  uVar110 = (undefined2)((ulong)uVar68 >> 0x20);
  auVar131._12_4_ = auVar132._12_4_;
  auVar131._8_2_ = 0;
  auVar131._0_8_ = uVar55;
  auVar131._10_2_ = uVar110;
  auVar130._10_6_ = auVar131._10_6_;
  auVar130._8_2_ = uVar110;
  auVar130._0_8_ = uVar55;
  uVar110 = (undefined2)uVar28;
  auVar32._4_8_ = auVar130._8_8_;
  auVar32._2_2_ = uVar110;
  auVar32._0_2_ = uVar110;
  fVar65 = (float)((int)sVar119 >> 8);
  fVar111 = (float)(auVar32._0_4_ >> 0x18);
  fVar114 = (float)(auVar130._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar56 * 0xc + 6);
  uVar156 = (undefined1)((uint)uVar45 >> 0x18);
  uVar110 = CONCAT11(uVar156,uVar156);
  uVar156 = (undefined1)((uint)uVar45 >> 0x10);
  uVar68 = CONCAT35(CONCAT21(uVar110,uVar156),CONCAT14(uVar156,uVar45));
  uVar156 = (undefined1)((uint)uVar45 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar68 >> 0x20),uVar156),uVar156);
  sVar119 = CONCAT11((char)uVar45,(char)uVar45);
  uVar55 = CONCAT62(uVar28,sVar119);
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar55;
  auVar227._12_2_ = uVar110;
  auVar227._14_2_ = uVar110;
  uVar110 = (undefined2)((ulong)uVar68 >> 0x20);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar55;
  auVar226._10_2_ = uVar110;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = uVar110;
  auVar225._0_8_ = uVar55;
  uVar110 = (undefined2)uVar28;
  auVar33._4_8_ = auVar225._8_8_;
  auVar33._2_2_ = uVar110;
  auVar33._0_2_ = uVar110;
  fVar249 = (float)((int)sVar119 >> 8);
  fVar253 = (float)(auVar33._0_4_ >> 0x18);
  fVar254 = (float)(auVar225._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar56 * 0xd + 6);
  uVar156 = (undefined1)((uint)uVar45 >> 0x18);
  uVar110 = CONCAT11(uVar156,uVar156);
  uVar156 = (undefined1)((uint)uVar45 >> 0x10);
  uVar68 = CONCAT35(CONCAT21(uVar110,uVar156),CONCAT14(uVar156,uVar45));
  uVar156 = (undefined1)((uint)uVar45 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar68 >> 0x20),uVar156),uVar156);
  sVar119 = CONCAT11((char)uVar45,(char)uVar45);
  uVar55 = CONCAT62(uVar28,sVar119);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar55;
  auVar230._12_2_ = uVar110;
  auVar230._14_2_ = uVar110;
  uVar110 = (undefined2)((ulong)uVar68 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar55;
  auVar229._10_2_ = uVar110;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar110;
  auVar228._0_8_ = uVar55;
  uVar110 = (undefined2)uVar28;
  auVar34._4_8_ = auVar228._8_8_;
  auVar34._2_2_ = uVar110;
  auVar34._0_2_ = uVar110;
  fVar304 = (float)((int)sVar119 >> 8);
  fVar310 = (float)(auVar34._0_4_ >> 0x18);
  fVar313 = (float)(auVar228._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar56 * 0x12 + 6);
  uVar156 = (undefined1)((uint)uVar45 >> 0x18);
  uVar110 = CONCAT11(uVar156,uVar156);
  uVar156 = (undefined1)((uint)uVar45 >> 0x10);
  uVar68 = CONCAT35(CONCAT21(uVar110,uVar156),CONCAT14(uVar156,uVar45));
  uVar156 = (undefined1)((uint)uVar45 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar68 >> 0x20),uVar156),uVar156);
  sVar119 = CONCAT11((char)uVar45,(char)uVar45);
  uVar55 = CONCAT62(uVar28,sVar119);
  auVar233._8_4_ = 0;
  auVar233._0_8_ = uVar55;
  auVar233._12_2_ = uVar110;
  auVar233._14_2_ = uVar110;
  uVar110 = (undefined2)((ulong)uVar68 >> 0x20);
  auVar232._12_4_ = auVar233._12_4_;
  auVar232._8_2_ = 0;
  auVar232._0_8_ = uVar55;
  auVar232._10_2_ = uVar110;
  auVar231._10_6_ = auVar232._10_6_;
  auVar231._8_2_ = uVar110;
  auVar231._0_8_ = uVar55;
  uVar110 = (undefined2)uVar28;
  auVar35._4_8_ = auVar231._8_8_;
  auVar35._2_2_ = uVar110;
  auVar35._0_2_ = uVar110;
  fVar286 = (float)((int)sVar119 >> 8);
  fVar296 = (float)(auVar35._0_4_ >> 0x18);
  fVar299 = (float)(auVar231._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar56 * 0x13 + 6);
  uVar156 = (undefined1)((uint)uVar45 >> 0x18);
  uVar110 = CONCAT11(uVar156,uVar156);
  uVar156 = (undefined1)((uint)uVar45 >> 0x10);
  uVar68 = CONCAT35(CONCAT21(uVar110,uVar156),CONCAT14(uVar156,uVar45));
  uVar156 = (undefined1)((uint)uVar45 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar68 >> 0x20),uVar156),uVar156);
  sVar119 = CONCAT11((char)uVar45,(char)uVar45);
  uVar55 = CONCAT62(uVar28,sVar119);
  auVar236._8_4_ = 0;
  auVar236._0_8_ = uVar55;
  auVar236._12_2_ = uVar110;
  auVar236._14_2_ = uVar110;
  uVar110 = (undefined2)((ulong)uVar68 >> 0x20);
  auVar235._12_4_ = auVar236._12_4_;
  auVar235._8_2_ = 0;
  auVar235._0_8_ = uVar55;
  auVar235._10_2_ = uVar110;
  auVar234._10_6_ = auVar235._10_6_;
  auVar234._8_2_ = uVar110;
  auVar234._0_8_ = uVar55;
  uVar110 = (undefined2)uVar28;
  auVar36._4_8_ = auVar234._8_8_;
  auVar36._2_2_ = uVar110;
  auVar36._0_2_ = uVar110;
  fVar318 = (float)((int)sVar119 >> 8);
  fVar323 = (float)(auVar36._0_4_ >> 0x18);
  fVar327 = (float)(auVar234._8_4_ >> 0x18);
  uVar45 = *(undefined4 *)(prim + uVar56 * 0x14 + 6);
  uVar156 = (undefined1)((uint)uVar45 >> 0x18);
  uVar110 = CONCAT11(uVar156,uVar156);
  uVar156 = (undefined1)((uint)uVar45 >> 0x10);
  uVar68 = CONCAT35(CONCAT21(uVar110,uVar156),CONCAT14(uVar156,uVar45));
  uVar156 = (undefined1)((uint)uVar45 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar68 >> 0x20),uVar156),uVar156);
  sVar119 = CONCAT11((char)uVar45,(char)uVar45);
  uVar55 = CONCAT62(uVar28,sVar119);
  auVar339._8_4_ = 0;
  auVar339._0_8_ = uVar55;
  auVar339._12_2_ = uVar110;
  auVar339._14_2_ = uVar110;
  uVar110 = (undefined2)((ulong)uVar68 >> 0x20);
  auVar338._12_4_ = auVar339._12_4_;
  auVar338._8_2_ = 0;
  auVar338._0_8_ = uVar55;
  auVar338._10_2_ = uVar110;
  auVar337._10_6_ = auVar338._10_6_;
  auVar337._8_2_ = uVar110;
  auVar337._0_8_ = uVar55;
  uVar110 = (undefined2)uVar28;
  auVar37._4_8_ = auVar337._8_8_;
  auVar37._2_2_ = uVar110;
  auVar37._0_2_ = uVar110;
  fVar120 = (float)((int)sVar119 >> 8);
  fVar157 = (float)(auVar37._0_4_ >> 0x18);
  fVar158 = (float)(auVar337._8_4_ >> 0x18);
  fVar356 = fVar173 * fVar159 + fVar192 * fVar204 + fVar193 * fVar255;
  fVar360 = fVar173 * fVar168 + fVar192 * fVar218 + fVar193 * fVar268;
  fVar361 = fVar173 * fVar170 + fVar192 * fVar219 + fVar193 * fVar274;
  fVar362 = fVar173 * (float)(auVar122._12_4_ >> 0x18) +
            fVar192 * (float)(auVar125._12_4_ >> 0x18) + fVar193 * (float)(auVar128._12_4_ >> 0x18);
  fVar334 = fVar173 * fVar65 + fVar192 * fVar249 + fVar193 * fVar304;
  fVar345 = fVar173 * fVar111 + fVar192 * fVar253 + fVar193 * fVar310;
  fVar349 = fVar173 * fVar114 + fVar192 * fVar254 + fVar193 * fVar313;
  fVar352 = fVar173 * (float)(auVar131._12_4_ >> 0x18) +
            fVar192 * (float)(auVar226._12_4_ >> 0x18) + fVar193 * (float)(auVar229._12_4_ >> 0x18);
  fVar223 = fVar173 * fVar286 + fVar192 * fVar318 + fVar193 * fVar120;
  fVar244 = fVar173 * fVar296 + fVar192 * fVar323 + fVar193 * fVar157;
  fVar246 = fVar173 * fVar299 + fVar192 * fVar327 + fVar193 * fVar158;
  fVar193 = fVar173 * (float)(auVar232._12_4_ >> 0x18) +
            fVar192 * (float)(auVar235._12_4_ >> 0x18) + fVar193 * (float)(auVar338._12_4_ >> 0x18);
  fVar204 = fVar159 * fVar194 + fVar204 * fVar202 + fVar255 * fVar203;
  fVar218 = fVar168 * fVar194 + fVar218 * fVar202 + fVar268 * fVar203;
  fVar219 = fVar170 * fVar194 + fVar219 * fVar202 + fVar274 * fVar203;
  fVar255 = (float)(auVar122._12_4_ >> 0x18) * fVar194 +
            (float)(auVar125._12_4_ >> 0x18) * fVar202 + (float)(auVar128._12_4_ >> 0x18) * fVar203;
  fVar268 = fVar65 * fVar194 + fVar249 * fVar202 + fVar304 * fVar203;
  fVar274 = fVar111 * fVar194 + fVar253 * fVar202 + fVar310 * fVar203;
  fVar304 = fVar114 * fVar194 + fVar254 * fVar202 + fVar313 * fVar203;
  fVar310 = (float)(auVar131._12_4_ >> 0x18) * fVar194 +
            (float)(auVar226._12_4_ >> 0x18) * fVar202 + (float)(auVar229._12_4_ >> 0x18) * fVar203;
  fVar249 = fVar194 * fVar286 + fVar202 * fVar318 + fVar203 * fVar120;
  fVar253 = fVar194 * fVar296 + fVar202 * fVar323 + fVar203 * fVar157;
  fVar254 = fVar194 * fVar299 + fVar202 * fVar327 + fVar203 * fVar158;
  fVar194 = fVar194 * (float)(auVar232._12_4_ >> 0x18) +
            fVar202 * (float)(auVar235._12_4_ >> 0x18) + fVar203 * (float)(auVar338._12_4_ >> 0x18);
  uVar66 = (uint)DAT_01f46710;
  uVar112 = DAT_01f46710._4_4_;
  uVar115 = DAT_01f46710._8_4_;
  uVar117 = DAT_01f46710._12_4_;
  uVar61 = -(uint)(1e-18 <= (float)((uint)fVar356 & uVar66));
  uVar62 = -(uint)(1e-18 <= (float)((uint)fVar360 & uVar112));
  uVar63 = -(uint)(1e-18 <= (float)((uint)fVar361 & uVar115));
  uVar64 = -(uint)(1e-18 <= (float)((uint)fVar362 & uVar117));
  auVar357._0_4_ = (uint)fVar356 & uVar61;
  auVar357._4_4_ = (uint)fVar360 & uVar62;
  auVar357._8_4_ = (uint)fVar361 & uVar63;
  auVar357._12_4_ = (uint)fVar362 & uVar64;
  auVar195._0_8_ = CONCAT44(~uVar62,~uVar61) & 0x219392ef219392ef;
  auVar195._8_4_ = ~uVar63 & 0x219392ef;
  auVar195._12_4_ = ~uVar64 & 0x219392ef;
  auVar195 = auVar195 | auVar357;
  uVar61 = -(uint)(1e-18 <= (float)((uint)fVar334 & uVar66));
  uVar62 = -(uint)(1e-18 <= (float)((uint)fVar345 & uVar112));
  uVar63 = -(uint)(1e-18 <= (float)((uint)fVar349 & uVar115));
  uVar64 = -(uint)(1e-18 <= (float)((uint)fVar352 & uVar117));
  auVar340._0_4_ = (uint)fVar334 & uVar61;
  auVar340._4_4_ = (uint)fVar345 & uVar62;
  auVar340._8_4_ = (uint)fVar349 & uVar63;
  auVar340._12_4_ = (uint)fVar352 & uVar64;
  auVar205._0_8_ = CONCAT44(~uVar62,~uVar61) & 0x219392ef219392ef;
  auVar205._8_4_ = ~uVar63 & 0x219392ef;
  auVar205._12_4_ = ~uVar64 & 0x219392ef;
  auVar205 = auVar205 | auVar340;
  uVar61 = -(uint)(1e-18 <= (float)((uint)fVar223 & uVar66));
  uVar62 = -(uint)(1e-18 <= (float)((uint)fVar244 & uVar112));
  uVar63 = -(uint)(1e-18 <= (float)((uint)fVar246 & uVar115));
  uVar64 = -(uint)(1e-18 <= (float)((uint)fVar193 & uVar117));
  auVar237._0_4_ = (uint)fVar223 & uVar61;
  auVar237._4_4_ = (uint)fVar244 & uVar62;
  auVar237._8_4_ = (uint)fVar246 & uVar63;
  auVar237._12_4_ = (uint)fVar193 & uVar64;
  auVar289._0_8_ = CONCAT44(~uVar62,~uVar61) & 0x219392ef219392ef;
  auVar289._8_4_ = ~uVar63 & 0x219392ef;
  auVar289._12_4_ = ~uVar64 & 0x219392ef;
  auVar289 = auVar289 | auVar237;
  auVar69 = rcpps(_DAT_01f46710,auVar195);
  fVar193 = auVar69._0_4_;
  fVar114 = auVar69._4_4_;
  fVar158 = auVar69._8_4_;
  fVar170 = auVar69._12_4_;
  fVar193 = (1.0 - auVar195._0_4_ * fVar193) * fVar193 + fVar193;
  fVar114 = (1.0 - auVar195._4_4_ * fVar114) * fVar114 + fVar114;
  fVar158 = (1.0 - auVar195._8_4_ * fVar158) * fVar158 + fVar158;
  fVar170 = (1.0 - auVar195._12_4_ * fVar170) * fVar170 + fVar170;
  auVar69 = rcpps(auVar69,auVar205);
  fVar65 = auVar69._0_4_;
  fVar120 = auVar69._4_4_;
  fVar159 = auVar69._8_4_;
  fVar173 = auVar69._12_4_;
  fVar65 = (1.0 - auVar205._0_4_ * fVar65) * fVar65 + fVar65;
  fVar120 = (1.0 - auVar205._4_4_ * fVar120) * fVar120 + fVar120;
  fVar159 = (1.0 - auVar205._8_4_ * fVar159) * fVar159 + fVar159;
  fVar173 = (1.0 - auVar205._12_4_ * fVar173) * fVar173 + fVar173;
  auVar69 = rcpps(auVar69,auVar289);
  fVar111 = auVar69._0_4_;
  fVar157 = auVar69._4_4_;
  fVar168 = auVar69._8_4_;
  fVar192 = auVar69._12_4_;
  fVar111 = (1.0 - auVar289._0_4_ * fVar111) * fVar111 + fVar111;
  fVar157 = (1.0 - auVar289._4_4_ * fVar157) * fVar157 + fVar157;
  fVar168 = (1.0 - auVar289._8_4_ * fVar168) * fVar168 + fVar168;
  fVar192 = (1.0 - auVar289._12_4_ * fVar192) * fVar192 + fVar192;
  uVar55 = *(ulong *)(prim + uVar56 * 7 + 6);
  uVar110 = (undefined2)(uVar55 >> 0x30);
  auVar291._8_4_ = 0;
  auVar291._0_8_ = uVar55;
  auVar291._12_2_ = uVar110;
  auVar291._14_2_ = uVar110;
  uVar110 = (undefined2)(uVar55 >> 0x20);
  auVar175._12_4_ = auVar291._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar55;
  auVar175._10_2_ = uVar110;
  auVar69._10_6_ = auVar175._10_6_;
  auVar69._8_2_ = uVar110;
  auVar69._0_8_ = uVar55;
  uVar110 = (undefined2)(uVar55 >> 0x10);
  auVar38._4_8_ = auVar69._8_8_;
  auVar38._2_2_ = uVar110;
  auVar38._0_2_ = uVar110;
  auVar196._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar218) * fVar114,
                ((float)(int)(short)uVar55 - fVar204) * fVar193);
  auVar196._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar219) * fVar158;
  auVar196._12_4_ = ((float)(auVar175._12_4_ >> 0x10) - fVar255) * fVar170;
  uVar55 = *(ulong *)(prim + uVar56 * 9 + 6);
  uVar110 = (undefined2)(uVar55 >> 0x30);
  auVar343._8_4_ = 0;
  auVar343._0_8_ = uVar55;
  auVar343._12_2_ = uVar110;
  auVar343._14_2_ = uVar110;
  uVar110 = (undefined2)(uVar55 >> 0x20);
  auVar70._12_4_ = auVar343._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar55;
  auVar70._10_2_ = uVar110;
  auVar373._10_6_ = auVar70._10_6_;
  auVar373._8_2_ = uVar110;
  auVar373._0_8_ = uVar55;
  uVar110 = (undefined2)(uVar55 >> 0x10);
  auVar39._4_8_ = auVar373._8_8_;
  auVar39._2_2_ = uVar110;
  auVar39._0_2_ = uVar110;
  auVar206._0_4_ = ((float)(int)(short)uVar55 - fVar204) * fVar193;
  auVar206._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar218) * fVar114;
  auVar206._8_4_ = ((float)(auVar373._8_4_ >> 0x10) - fVar219) * fVar158;
  auVar206._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar255) * fVar170;
  uVar55 = *(ulong *)(prim + uVar56 * 0xe + 6);
  uVar110 = (undefined2)(uVar55 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar55;
  auVar73._12_2_ = uVar110;
  auVar73._14_2_ = uVar110;
  uVar110 = (undefined2)(uVar55 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar55;
  auVar72._10_2_ = uVar110;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar110;
  auVar71._0_8_ = uVar55;
  uVar110 = (undefined2)(uVar55 >> 0x10);
  auVar40._4_8_ = auVar71._8_8_;
  auVar40._2_2_ = uVar110;
  auVar40._0_2_ = uVar110;
  auVar161._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar274) * fVar120,
                ((float)(int)(short)uVar55 - fVar268) * fVar65);
  auVar161._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar304) * fVar159;
  auVar161._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar310) * fVar173;
  uVar61 = (uint)(byte)PVar8;
  uVar55 = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  uVar110 = (undefined2)(uVar55 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar55;
  auVar76._12_2_ = uVar110;
  auVar76._14_2_ = uVar110;
  uVar110 = (undefined2)(uVar55 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar55;
  auVar75._10_2_ = uVar110;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar110;
  auVar74._0_8_ = uVar55;
  uVar110 = (undefined2)(uVar55 >> 0x10);
  auVar41._4_8_ = auVar74._8_8_;
  auVar41._2_2_ = uVar110;
  auVar41._0_2_ = uVar110;
  auVar262._0_4_ = ((float)(int)(short)uVar55 - fVar268) * fVar65;
  auVar262._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar274) * fVar120;
  auVar262._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar304) * fVar159;
  auVar262._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar310) * fVar173;
  uVar55 = *(ulong *)(prim + uVar56 * 0x15 + 6);
  uVar110 = (undefined2)(uVar55 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar55;
  auVar79._12_2_ = uVar110;
  auVar79._14_2_ = uVar110;
  uVar110 = (undefined2)(uVar55 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar55;
  auVar78._10_2_ = uVar110;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar110;
  auVar77._0_8_ = uVar55;
  uVar110 = (undefined2)(uVar55 >> 0x10);
  auVar42._4_8_ = auVar77._8_8_;
  auVar42._2_2_ = uVar110;
  auVar42._0_2_ = uVar110;
  auVar133._0_8_ =
       CONCAT44(((float)(auVar42._0_4_ >> 0x10) - fVar253) * fVar157,
                ((float)(int)(short)uVar55 - fVar249) * fVar111);
  auVar133._8_4_ = ((float)(auVar77._8_4_ >> 0x10) - fVar254) * fVar168;
  auVar133._12_4_ = ((float)(auVar78._12_4_ >> 0x10) - fVar194) * fVar192;
  uVar55 = *(ulong *)(prim + uVar56 * 0x17 + 6);
  uVar110 = (undefined2)(uVar55 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar55;
  auVar82._12_2_ = uVar110;
  auVar82._14_2_ = uVar110;
  uVar110 = (undefined2)(uVar55 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar55;
  auVar81._10_2_ = uVar110;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar110;
  auVar80._0_8_ = uVar55;
  uVar110 = (undefined2)(uVar55 >> 0x10);
  auVar43._4_8_ = auVar80._8_8_;
  auVar43._2_2_ = uVar110;
  auVar43._0_2_ = uVar110;
  auVar250._0_4_ = ((float)(int)(short)uVar55 - fVar249) * fVar111;
  auVar250._4_4_ = ((float)(auVar43._0_4_ >> 0x10) - fVar253) * fVar157;
  auVar250._8_4_ = ((float)(auVar80._8_4_ >> 0x10) - fVar254) * fVar168;
  auVar250._12_4_ = ((float)(auVar81._12_4_ >> 0x10) - fVar194) * fVar192;
  auVar174._8_4_ = auVar196._8_4_;
  auVar174._0_8_ = auVar196._0_8_;
  auVar174._12_4_ = auVar196._12_4_;
  auVar175 = minps(auVar174,auVar206);
  auVar83._8_4_ = auVar161._8_4_;
  auVar83._0_8_ = auVar161._0_8_;
  auVar83._12_4_ = auVar161._12_4_;
  auVar69 = minps(auVar83,auVar262);
  auVar175 = maxps(auVar175,auVar69);
  auVar84._8_4_ = auVar133._8_4_;
  auVar84._0_8_ = auVar133._0_8_;
  auVar84._12_4_ = auVar133._12_4_;
  auVar69 = minps(auVar84,auVar250);
  auVar238._4_4_ = uVar47;
  auVar238._0_4_ = uVar47;
  auVar238._8_4_ = uVar47;
  auVar238._12_4_ = uVar47;
  auVar69 = maxps(auVar69,auVar238);
  auVar69 = maxps(auVar175,auVar69);
  fVar193 = auVar69._0_4_ * 0.99999964;
  fVar65 = auVar69._4_4_ * 0.99999964;
  fVar111 = auVar69._8_4_ * 0.99999964;
  fVar114 = auVar69._12_4_ * 0.99999964;
  auVar175 = maxps(auVar196,auVar206);
  auVar69 = maxps(auVar161,auVar262);
  auVar175 = minps(auVar175,auVar69);
  auVar69 = maxps(auVar133,auVar250);
  uVar47 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar162._4_4_ = uVar47;
  auVar162._0_4_ = uVar47;
  auVar162._8_4_ = uVar47;
  auVar162._12_4_ = uVar47;
  auVar69 = minps(auVar69,auVar162);
  auVar69 = minps(auVar175,auVar69);
  auVar134._0_4_ = -(uint)(uVar61 != 0 && fVar193 <= auVar69._0_4_ * 1.0000004);
  auVar134._4_4_ = -(uint)(1 < uVar61 && fVar65 <= auVar69._4_4_ * 1.0000004);
  auVar134._8_4_ = -(uint)(2 < uVar61 && fVar111 <= auVar69._8_4_ * 1.0000004);
  auVar134._12_4_ = -(uint)(3 < uVar61 && fVar114 <= auVar69._12_4_ * 1.0000004);
  uVar61 = movmskps(uVar61 << 4,auVar134);
  auVar135._0_12_ = mm_lookupmask_ps._240_12_;
  auVar135._12_4_ = 0;
LAB_002fd742:
  uVar55 = (ulong)uVar61;
  if (uVar55 == 0) {
LAB_003001da:
    return uVar55 != 0;
  }
  lVar50 = 0;
  if (uVar55 != 0) {
    for (; (uVar61 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
    }
  }
  uVar57 = uVar55 - 1 & uVar55;
  uVar61 = *(uint *)(prim + 2);
  local_5d0 = (__int_type_conflict)uVar61;
  uVar62 = *(uint *)(prim + lVar50 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[local_5d0].ptr;
  _Var53 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 + _Var53 * uVar62);
  p_Var10 = pGVar9[1].intersectionFilterN;
  lVar50 = *(long *)&pGVar9[1].time_range.upper;
  pfVar1 = (float *)(lVar50 + (long)p_Var10 * uVar56);
  pfVar2 = (float *)(lVar50 + (uVar56 + 1) * (long)p_Var10);
  pfVar3 = (float *)(lVar50 + (uVar56 + 2) * (long)p_Var10);
  lVar11 = 0;
  if (uVar57 != 0) {
    for (; (uVar57 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
    }
  }
  pfVar4 = (float *)(lVar50 + (uVar56 + 3) * (long)p_Var10);
  if ((uVar57 != 0) && (uVar56 = uVar57 - 1 & uVar57, uVar56 != 0)) {
    lVar50 = 0;
    if (uVar56 != 0) {
      for (; (uVar56 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
      }
    }
    _Var53 = _Var53 * *(uint *)(prim + lVar50 * 4 + 6);
  }
  fVar120 = *(float *)(ray + k * 4 + 0x40);
  local_5b8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x50);
  fVar159 = *(float *)(ray + k * 4 + 0x60);
  dir.field_0.m128[1] = (float)local_5b8._4_4_;
  dir.field_0.m128[0] = fVar120;
  dir.field_0.m128[2] = fVar159;
  dir.field_0.m128[3] = 0.0;
  fVar157 = (float)local_5b8._4_4_ * (float)local_5b8._4_4_;
  fVar158 = fVar159 * fVar159;
  fVar170 = fVar157 + fVar120 * fVar120 + fVar158;
  auVar85._0_8_ = CONCAT44(fVar157 + fVar157 + 0.0,fVar170);
  auVar85._8_4_ = fVar157 + fVar158 + fVar158;
  auVar85._12_4_ = fVar157 + 0.0 + 0.0;
  auVar207._8_4_ = auVar85._8_4_;
  auVar207._0_8_ = auVar85._0_8_;
  auVar207._12_4_ = auVar85._12_4_;
  auVar69 = rcpss(auVar207,auVar85);
  fVar254 = (2.0 - auVar69._0_4_ * fVar170) * auVar69._0_4_ *
            (((pfVar1[2] + pfVar2[2]) * 0.5 - *(float *)(ray + k * 4 + 0x20)) * fVar159 +
            ((pfVar1[1] + pfVar2[1]) * 0.5 - *(float *)(ray + k * 4 + 0x10)) *
            (float)local_5b8._4_4_ + ((*pfVar1 + *pfVar2) * 0.5 - *(float *)(ray + k * 4)) * fVar120
            );
  fVar255 = fVar120 * fVar254 + *(float *)(ray + k * 4);
  fVar249 = (float)local_5b8._4_4_ * fVar254 + *(float *)(ray + k * 4 + 0x10);
  fVar253 = fVar159 * fVar254 + *(float *)(ray + k * 4 + 0x20);
  fVar194 = *pfVar1 - fVar255;
  fVar202 = pfVar1[1] - fVar249;
  fVar203 = pfVar1[2] - fVar253;
  fVar223 = pfVar1[3] - 0.0;
  fVar304 = *pfVar3 - fVar255;
  fVar310 = pfVar3[1] - fVar249;
  fVar313 = pfVar3[2] - fVar253;
  fVar318 = pfVar3[3] - 0.0;
  fVar244 = *pfVar2 - fVar255;
  fVar246 = pfVar2[1] - fVar249;
  fVar268 = pfVar2[2] - fVar253;
  fVar274 = pfVar2[3] - 0.0;
  fVar255 = *pfVar4 - fVar255;
  fVar249 = pfVar4[1] - fVar249;
  fVar253 = pfVar4[2] - fVar253;
  fVar323 = pfVar4[3] - 0.0;
  fVar157 = (float)local_5b8._4_4_ * (float)local_5b8._4_4_;
  fVar120 = fVar120 * fVar120;
  fVar286 = fVar120 + fVar157 + fVar158;
  fVar296 = fVar120 + fVar157 + fVar158;
  fVar299 = fVar120 + fVar157 + fVar158;
  fVar120 = fVar120 + fVar157 + fVar158;
  fVar157 = *(float *)(ray + k * 4 + 0x40);
  fVar173 = ABS(fVar286);
  fVar204 = ABS(fVar296);
  fVar218 = ABS(fVar299);
  fVar219 = ABS(fVar120);
  fVar158 = *(float *)(ray + k * 4 + 0x30);
  fVar192 = fVar158 - fVar254;
  bVar54 = 0;
  pSVar48 = (StackEntry *)0x1;
  local_6bc = 1;
  local_438._4_4_ = 0.0;
  fVar168 = 1.0;
  local_5b8._0_4_ = local_5b8._4_4_;
  fStack_5b0 = (float)local_5b8._4_4_;
  fStack_5ac = (float)local_5b8._4_4_;
  _Var52 = 0;
  do {
    fVar327 = fVar168 - (float)local_438._4_4_;
    local_438._0_4_ = local_438._4_4_;
    fStack_430 = (float)local_438._4_4_;
    fStack_42c = (float)local_438._4_4_;
    fVar345 = fVar327 * 0.0 + (float)local_438._4_4_;
    fVar349 = fVar327 * 0.33333334 + (float)local_438._4_4_;
    fVar356 = fVar327 * 0.6666667 + (float)local_438._4_4_;
    fVar361 = fVar327 * 1.0 + (float)local_438._4_4_;
    fVar256 = 1.0 - fVar345;
    fVar269 = 1.0 - fVar349;
    fVar275 = 1.0 - fVar356;
    fVar280 = 1.0 - fVar361;
    fVar160 = fVar345 * 3.0;
    fVar169 = fVar349 * 3.0;
    fVar171 = fVar356 * 3.0;
    fVar172 = fVar361 * 3.0;
    fVar287 = ((fVar256 * 3.0 + -5.0) * fVar256 * fVar256 + 2.0) * 0.5;
    fVar297 = ((fVar269 * 3.0 + -5.0) * fVar269 * fVar269 + 2.0) * 0.5;
    fVar300 = ((fVar275 * 3.0 + -5.0) * fVar275 * fVar275 + 2.0) * 0.5;
    fVar302 = ((fVar280 * 3.0 + -5.0) * fVar280 * fVar280 + 2.0) * 0.5;
    fVar352 = -fVar256 * fVar345 * fVar345 * 0.5;
    fVar360 = -fVar269 * fVar349 * fVar349 * 0.5;
    fVar362 = -fVar275 * fVar356 * fVar356 * 0.5;
    fVar221 = -fVar280 * fVar361 * fVar361 * 0.5;
    fVar305 = (fVar345 * fVar345 * (fVar160 + -5.0) + 2.0) * 0.5;
    fVar311 = (fVar349 * fVar349 * (fVar169 + -5.0) + 2.0) * 0.5;
    fVar314 = (fVar356 * fVar356 * (fVar171 + -5.0) + 2.0) * 0.5;
    fVar316 = (fVar361 * fVar361 * (fVar172 + -5.0) + 2.0) * 0.5;
    fVar334 = fVar327 * 0.11111111;
    fVar369 = -fVar345 * fVar256 * fVar256 * 0.5;
    fVar374 = -fVar349 * fVar269 * fVar269 * 0.5;
    fVar377 = -fVar356 * fVar275 * fVar275 * 0.5;
    fVar380 = -fVar361 * fVar280 * fVar280 * 0.5;
    fVar257 = fVar194 * fVar369 + fVar244 * fVar305 + fVar304 * fVar287 + fVar255 * fVar352;
    fVar270 = fVar194 * fVar374 + fVar244 * fVar311 + fVar304 * fVar297 + fVar255 * fVar360;
    fVar276 = fVar194 * fVar377 + fVar244 * fVar314 + fVar304 * fVar300 + fVar255 * fVar362;
    fVar281 = fVar194 * fVar380 + fVar244 * fVar316 + fVar304 * fVar302 + fVar255 * fVar221;
    fVar258 = fVar202 * fVar369 + fVar246 * fVar305 + fVar310 * fVar287 + fVar249 * fVar352;
    fVar271 = fVar202 * fVar374 + fVar246 * fVar311 + fVar310 * fVar297 + fVar249 * fVar360;
    fVar277 = fVar202 * fVar377 + fVar246 * fVar314 + fVar310 * fVar300 + fVar249 * fVar362;
    fVar282 = fVar202 * fVar380 + fVar246 * fVar316 + fVar310 * fVar302 + fVar249 * fVar221;
    fVar335 = fVar203 * fVar369 + fVar268 * fVar305 + fVar313 * fVar287 + fVar253 * fVar352;
    fVar346 = fVar203 * fVar374 + fVar268 * fVar311 + fVar313 * fVar297 + fVar253 * fVar360;
    fVar350 = fVar203 * fVar377 + fVar268 * fVar314 + fVar313 * fVar300 + fVar253 * fVar362;
    fVar353 = fVar203 * fVar380 + fVar268 * fVar316 + fVar313 * fVar302 + fVar253 * fVar221;
    fVar370 = fVar369 * fVar223 + fVar305 * fVar274 + fVar287 * fVar318 + fVar352 * fVar323;
    fVar375 = fVar374 * fVar223 + fVar311 * fVar274 + fVar297 * fVar318 + fVar360 * fVar323;
    auVar372._0_8_ = CONCAT44(fVar375,fVar370);
    auVar372._8_4_ = fVar377 * fVar223 + fVar314 * fVar274 + fVar300 * fVar318 + fVar362 * fVar323;
    auVar372._12_4_ = fVar380 * fVar223 + fVar316 * fVar274 + fVar302 * fVar318 + fVar221 * fVar323;
    fVar287 = fVar345 * (fVar256 + fVar256);
    fVar297 = fVar349 * (fVar269 + fVar269);
    fVar302 = fVar356 * (fVar275 + fVar275);
    fVar311 = fVar361 * (fVar280 + fVar280);
    fVar259 = (fVar287 - fVar256 * fVar256) * 0.5;
    fVar300 = (fVar297 - fVar269 * fVar269) * 0.5;
    fVar305 = (fVar302 - fVar275 * fVar275) * 0.5;
    fVar314 = (fVar311 - fVar280 * fVar280) * 0.5;
    fVar221 = (fVar345 * fVar160 + (fVar345 + fVar345) * (fVar160 + -5.0)) * 0.5;
    fVar352 = (fVar349 * fVar169 + (fVar349 + fVar349) * (fVar169 + -5.0)) * 0.5;
    fVar360 = (fVar356 * fVar171 + (fVar356 + fVar356) * (fVar171 + -5.0)) * 0.5;
    fVar362 = (fVar361 * fVar172 + (fVar361 + fVar361) * (fVar172 + -5.0)) * 0.5;
    fVar256 = ((fVar160 + 2.0) * (fVar256 + fVar256) - fVar256 * 3.0 * fVar256) * 0.5;
    fVar160 = ((fVar169 + 2.0) * (fVar269 + fVar269) - fVar269 * 3.0 * fVar269) * 0.5;
    fVar169 = ((fVar171 + 2.0) * (fVar275 + fVar275) - fVar275 * 3.0 * fVar275) * 0.5;
    fVar171 = ((fVar172 + 2.0) * (fVar280 + fVar280) - fVar280 * 3.0 * fVar280) * 0.5;
    fVar377 = (fVar345 * fVar345 - fVar287) * 0.5;
    fVar345 = (fVar349 * fVar349 - fVar297) * 0.5;
    fVar356 = (fVar356 * fVar356 - fVar302) * 0.5;
    fVar361 = (fVar361 * fVar361 - fVar311) * 0.5;
    fVar374 = (fVar194 * fVar259 + fVar244 * fVar221 + fVar304 * fVar256 + fVar255 * fVar377) *
              fVar334;
    fVar380 = (fVar194 * fVar300 + fVar244 * fVar352 + fVar304 * fVar160 + fVar255 * fVar345) *
              fVar334;
    fVar220 = (fVar194 * fVar305 + fVar244 * fVar360 + fVar304 * fVar169 + fVar255 * fVar356) *
              fVar334;
    fVar222 = (fVar194 * fVar314 + fVar244 * fVar362 + fVar304 * fVar171 + fVar255 * fVar361) *
              fVar334;
    fVar306 = (fVar202 * fVar259 + fVar246 * fVar221 + fVar310 * fVar256 + fVar249 * fVar377) *
              fVar334;
    fVar312 = (fVar202 * fVar300 + fVar246 * fVar352 + fVar310 * fVar160 + fVar249 * fVar345) *
              fVar334;
    fVar315 = (fVar202 * fVar305 + fVar246 * fVar360 + fVar310 * fVar169 + fVar249 * fVar356) *
              fVar334;
    fVar317 = (fVar202 * fVar314 + fVar246 * fVar362 + fVar310 * fVar171 + fVar249 * fVar361) *
              fVar334;
    fVar319 = (fVar203 * fVar259 + fVar268 * fVar221 + fVar313 * fVar256 + fVar253 * fVar377) *
              fVar334;
    fVar324 = (fVar203 * fVar300 + fVar268 * fVar352 + fVar313 * fVar160 + fVar253 * fVar345) *
              fVar334;
    fVar328 = (fVar203 * fVar305 + fVar268 * fVar360 + fVar313 * fVar169 + fVar253 * fVar356) *
              fVar334;
    fVar331 = (fVar203 * fVar314 + fVar268 * fVar362 + fVar313 * fVar171 + fVar253 * fVar361) *
              fVar334;
    fVar349 = fVar334 * (fVar300 * fVar223 +
                        fVar352 * fVar274 + fVar160 * fVar318 + fVar345 * fVar323);
    fVar356 = fVar334 * (fVar305 * fVar223 +
                        fVar360 * fVar274 + fVar169 * fVar318 + fVar356 * fVar323);
    fVar361 = fVar334 * (fVar314 * fVar223 +
                        fVar362 * fVar274 + fVar171 * fVar318 + fVar361 * fVar323);
    auVar251._4_4_ = auVar372._8_4_;
    auVar251._0_4_ = fVar375;
    auVar251._8_4_ = auVar372._12_4_;
    auVar251._12_4_ = 0;
    auVar252._0_8_ = CONCAT44(auVar372._8_4_ - fVar356,fVar375 - fVar349);
    auVar252._8_4_ = auVar372._12_4_ - fVar361;
    auVar252._12_4_ = 0;
    auVar363._0_4_ = fVar271 - fVar258;
    auVar363._4_4_ = fVar277 - fVar271;
    auVar363._8_4_ = fVar282 - fVar277;
    auVar363._12_4_ = 0.0 - fVar282;
    fVar260 = fVar346 - fVar335;
    fVar272 = fVar350 - fVar346;
    fVar278 = fVar353 - fVar350;
    fVar283 = 0.0 - fVar353;
    fVar345 = fVar306 * fVar260 - fVar319 * auVar363._0_4_;
    fVar352 = fVar312 * fVar272 - fVar324 * auVar363._4_4_;
    fVar360 = fVar315 * fVar278 - fVar328 * auVar363._8_4_;
    fVar362 = fVar317 * fVar283 - fVar331 * auVar363._12_4_;
    fVar224 = fVar270 - fVar257;
    fVar245 = fVar276 - fVar270;
    fVar247 = fVar281 - fVar276;
    fVar248 = 0.0 - fVar281;
    fVar287 = fVar319 * fVar224 - fVar374 * fVar260;
    fVar297 = fVar324 * fVar245 - fVar380 * fVar272;
    fVar275 = fVar328 * fVar247 - fVar220 * fVar278;
    fVar305 = fVar331 * fVar248 - fVar222 * fVar283;
    fVar311 = fVar374 * auVar363._0_4_ - fVar306 * fVar224;
    fVar314 = fVar380 * auVar363._4_4_ - fVar312 * fVar245;
    fVar316 = fVar220 * auVar363._8_4_ - fVar315 * fVar247;
    fVar369 = fVar222 * auVar363._12_4_ - fVar317 * fVar248;
    auVar136._0_4_ = fVar260 * fVar260;
    auVar136._4_4_ = fVar272 * fVar272;
    auVar136._8_4_ = fVar278 * fVar278;
    auVar136._12_4_ = fVar283 * fVar283;
    auVar197._0_4_ = fVar224 * fVar224 + auVar363._0_4_ * auVar363._0_4_ + auVar136._0_4_;
    auVar197._4_4_ = fVar245 * fVar245 + auVar363._4_4_ * auVar363._4_4_ + auVar136._4_4_;
    auVar197._8_4_ = fVar247 * fVar247 + auVar363._8_4_ * auVar363._8_4_ + auVar136._8_4_;
    auVar197._12_4_ = fVar248 * fVar248 + auVar363._12_4_ * auVar363._12_4_ + auVar136._12_4_;
    auVar69 = rcpps(auVar136,auVar197);
    fVar160 = auVar69._0_4_;
    fVar169 = auVar69._4_4_;
    fVar171 = auVar69._8_4_;
    fVar172 = auVar69._12_4_;
    fVar160 = (1.0 - fVar160 * auVar197._0_4_) * fVar160 + fVar160;
    fVar169 = (1.0 - fVar169 * auVar197._4_4_) * fVar169 + fVar169;
    fVar171 = (1.0 - fVar171 * auVar197._8_4_) * fVar171 + fVar171;
    fVar172 = (1.0 - fVar172 * auVar197._12_4_) * fVar172 + fVar172;
    fVar269 = fVar260 * fVar312 - auVar363._0_4_ * fVar324;
    fVar300 = fVar272 * fVar315 - auVar363._4_4_ * fVar328;
    fVar302 = fVar278 * fVar317 - auVar363._8_4_ * fVar331;
    fVar280 = fVar283 * 0.0 - auVar363._12_4_ * 0.0;
    fVar320 = fVar224 * fVar324 - fVar260 * fVar380;
    fVar325 = fVar245 * fVar328 - fVar272 * fVar220;
    fVar329 = fVar247 * fVar331 - fVar278 * fVar222;
    fVar332 = fVar248 * 0.0 - fVar283 * 0.0;
    fVar336 = auVar363._0_4_ * fVar380 - fVar224 * fVar312;
    fVar347 = auVar363._4_4_ * fVar220 - fVar245 * fVar315;
    fVar351 = auVar363._8_4_ * fVar222 - fVar247 * fVar317;
    fVar354 = auVar363._12_4_ * 0.0 - fVar248 * 0.0;
    auVar86._0_4_ = (fVar345 * fVar345 + fVar287 * fVar287 + fVar311 * fVar311) * fVar160;
    auVar86._4_4_ = (fVar352 * fVar352 + fVar297 * fVar297 + fVar314 * fVar314) * fVar169;
    auVar86._8_4_ = (fVar360 * fVar360 + fVar275 * fVar275 + fVar316 * fVar316) * fVar171;
    auVar86._12_4_ = (fVar362 * fVar362 + fVar305 * fVar305 + fVar369 * fVar369) * fVar172;
    auVar176._0_4_ = (fVar269 * fVar269 + fVar320 * fVar320 + fVar336 * fVar336) * fVar160;
    auVar176._4_4_ = (fVar300 * fVar300 + fVar325 * fVar325 + fVar347 * fVar347) * fVar169;
    auVar176._8_4_ = (fVar302 * fVar302 + fVar329 * fVar329 + fVar351 * fVar351) * fVar171;
    auVar176._12_4_ = (fVar280 * fVar280 + fVar332 * fVar332 + fVar354 * fVar354) * fVar172;
    auVar69 = maxps(auVar86,auVar176);
    auVar290._8_4_ = auVar372._8_4_;
    auVar290._0_8_ = auVar372._0_8_;
    auVar290._12_4_ = auVar372._12_4_;
    auVar15._4_4_ = fVar375 + fVar349;
    auVar15._0_4_ =
         fVar370 + fVar334 * (fVar259 * fVar223 +
                             fVar221 * fVar274 + fVar256 * fVar318 + fVar377 * fVar323);
    auVar15._8_4_ = auVar372._8_4_ + fVar356;
    auVar15._12_4_ = auVar372._12_4_ + fVar361;
    auVar291 = maxps(auVar290,auVar15);
    auVar177._8_4_ = auVar252._8_4_;
    auVar177._0_8_ = auVar252._0_8_;
    auVar177._12_4_ = 0;
    auVar175 = maxps(auVar177,auVar251);
    auVar291 = maxps(auVar291,auVar175);
    auVar373 = minps(auVar372,auVar15);
    auVar175 = minps(auVar252,auVar251);
    auVar373 = minps(auVar373,auVar175);
    auVar69 = sqrtps(auVar69,auVar69);
    auVar175 = rsqrtps(auVar69,auVar197);
    fVar334 = auVar175._0_4_;
    fVar345 = auVar175._4_4_;
    fVar349 = auVar175._8_4_;
    fVar352 = auVar175._12_4_;
    fVar311 = fVar334 * 1.5 - fVar334 * fVar334 * auVar197._0_4_ * 0.5 * fVar334;
    fVar314 = fVar345 * 1.5 - fVar345 * fVar345 * auVar197._4_4_ * 0.5 * fVar345;
    fVar316 = fVar349 * 1.5 - fVar349 * fVar349 * auVar197._8_4_ * 0.5 * fVar349;
    fVar369 = fVar352 * 1.5 - fVar352 * fVar352 * auVar197._12_4_ * 0.5 * fVar352;
    fVar221 = 0.0 - fVar258;
    fVar171 = 0.0 - fVar271;
    fVar287 = 0.0 - fVar277;
    fVar300 = 0.0 - fVar282;
    fVar377 = 0.0 - fVar335;
    fVar259 = 0.0 - fVar346;
    fVar320 = 0.0 - fVar350;
    fVar325 = 0.0 - fVar353;
    fVar348 = local_5b8._4_4_;
    fVar355 = local_5b8._12_4_;
    fVar305 = local_5b8._0_4_;
    fVar280 = local_5b8._8_4_;
    fVar334 = 0.0 - fVar257;
    fVar349 = 0.0 - fVar270;
    fVar356 = 0.0 - fVar276;
    fVar361 = 0.0 - fVar281;
    fVar351 = fVar157 * fVar224 * fVar311 +
              fVar305 * auVar363._0_4_ * fVar311 + fVar159 * fVar260 * fVar311;
    fVar354 = fVar157 * fVar245 * fVar314 +
              fVar348 * auVar363._4_4_ * fVar314 + fVar159 * fVar272 * fVar314;
    fVar370 = fVar157 * fVar247 * fVar316 +
              fVar280 * auVar363._8_4_ * fVar316 + fVar159 * fVar278 * fVar316;
    fVar375 = fVar157 * fVar248 * fVar369 +
              fVar355 * auVar363._12_4_ * fVar369 + fVar159 * fVar283 * fVar369;
    fVar329 = fVar224 * fVar311 * fVar334 +
              auVar363._0_4_ * fVar311 * fVar221 + fVar260 * fVar311 * fVar377;
    fVar332 = fVar245 * fVar314 * fVar349 +
              auVar363._4_4_ * fVar314 * fVar171 + fVar272 * fVar314 * fVar259;
    fVar336 = fVar247 * fVar316 * fVar356 +
              auVar363._8_4_ * fVar316 * fVar287 + fVar278 * fVar316 * fVar320;
    fVar347 = fVar248 * fVar369 * fVar361 +
              auVar363._12_4_ * fVar369 * fVar300 + fVar283 * fVar369 * fVar325;
    fVar321 = (fVar157 * fVar334 + fVar305 * fVar221 + fVar159 * fVar377) - fVar351 * fVar329;
    fVar326 = (fVar157 * fVar349 + fVar348 * fVar171 + fVar159 * fVar259) - fVar354 * fVar332;
    fVar330 = (fVar157 * fVar356 + fVar280 * fVar287 + fVar159 * fVar320) - fVar370 * fVar336;
    fVar333 = (fVar157 * fVar361 + fVar355 * fVar300 + fVar159 * fVar325) - fVar375 * fVar347;
    fVar169 = (fVar334 * fVar334 + fVar221 * fVar221 + fVar377 * fVar377) - fVar329 * fVar329;
    fVar256 = (fVar349 * fVar349 + fVar171 * fVar171 + fVar259 * fVar259) - fVar332 * fVar332;
    fVar297 = (fVar356 * fVar356 + fVar287 * fVar287 + fVar320 * fVar320) - fVar336 * fVar336;
    fVar302 = (fVar361 * fVar361 + fVar300 * fVar300 + fVar325 * fVar325) - fVar347 * fVar347;
    fVar345 = (auVar291._0_4_ + auVar69._0_4_) * 1.0000002;
    fVar352 = (auVar291._4_4_ + auVar69._4_4_) * 1.0000002;
    fVar360 = (auVar291._8_4_ + auVar69._8_4_) * 1.0000002;
    fVar362 = (auVar291._12_4_ + auVar69._12_4_) * 1.0000002;
    fVar345 = fVar169 - fVar345 * fVar345;
    fVar352 = fVar256 - fVar352 * fVar352;
    fVar360 = fVar297 - fVar360 * fVar360;
    fVar362 = fVar302 - fVar362 * fVar362;
    fVar371 = fVar286 - fVar351 * fVar351;
    fVar376 = fVar296 - fVar354 * fVar354;
    fVar378 = fVar299 - fVar370 * fVar370;
    fVar381 = fVar120 - fVar375 * fVar375;
    fVar321 = fVar321 + fVar321;
    fVar326 = fVar326 + fVar326;
    fVar330 = fVar330 + fVar330;
    fVar333 = fVar333 + fVar333;
    auVar307._0_4_ = fVar321 * fVar321 - fVar371 * 4.0 * fVar345;
    auVar307._4_4_ = fVar326 * fVar326 - fVar376 * 4.0 * fVar352;
    auVar307._8_4_ = fVar330 * fVar330 - fVar378 * 4.0 * fVar360;
    auVar307._12_4_ = fVar333 * fVar333 - fVar381 * 4.0 * fVar362;
    auVar198._4_4_ = -(uint)(0.0 <= auVar307._4_4_);
    auVar198._0_4_ = -(uint)(0.0 <= auVar307._0_4_);
    auVar198._8_4_ = -(uint)(0.0 <= auVar307._8_4_);
    auVar198._12_4_ = -(uint)(0.0 <= auVar307._12_4_);
    uVar47 = (undefined4)((ulong)pSVar48 >> 0x20);
    iVar44 = movmskps((int)pSVar48,auVar198);
    auVar292._0_8_ = CONCAT44(fVar326,fVar321) ^ 0x8000000080000000;
    auVar292._8_4_ = -fVar330;
    auVar292._12_4_ = -fVar333;
    auVar178._0_8_ = CONCAT44(fVar354 * fVar354,fVar351 * fVar351) & 0x7fffffff7fffffff;
    auVar178._8_4_ = ABS(fVar370 * fVar370);
    auVar178._12_4_ = ABS(fVar375 * fVar375);
    fVar160 = ABS(fVar371);
    fVar172 = ABS(fVar376);
    fVar269 = ABS(fVar378);
    fVar275 = ABS(fVar381);
    if (iVar44 == 0) {
      iVar44 = 0;
      auVar89 = _DAT_01f45a40;
      auVar263 = _DAT_01f45a30;
      auVar293 = auVar292;
      auVar364 = auVar363;
    }
    else {
      auVar291 = sqrtps(_local_5b8,auVar307);
      uVar63 = -(uint)(0.0 <= auVar307._0_4_);
      uVar64 = -(uint)(0.0 <= auVar307._4_4_);
      uVar66 = -(uint)(0.0 <= auVar307._8_4_);
      uVar112 = -(uint)(0.0 <= auVar307._12_4_);
      auVar87._0_4_ = fVar371 + fVar371;
      auVar87._4_4_ = fVar376 + fVar376;
      auVar87._8_4_ = fVar378 + fVar378;
      auVar87._12_4_ = fVar381 + fVar381;
      auVar208._8_4_ = auVar178._8_4_;
      auVar208._0_8_ = auVar178._0_8_;
      auVar208._12_4_ = auVar178._12_4_;
      auVar175 = rcpps(auVar178,auVar87);
      fVar261 = auVar175._0_4_;
      fVar273 = auVar175._4_4_;
      fVar279 = auVar175._8_4_;
      fVar284 = auVar175._12_4_;
      fVar261 = (1.0 - auVar87._0_4_ * fVar261) * fVar261 + fVar261;
      fVar273 = (1.0 - auVar87._4_4_ * fVar273) * fVar273 + fVar273;
      fVar279 = (1.0 - auVar87._8_4_ * fVar279) * fVar279 + fVar279;
      fVar284 = (1.0 - auVar87._12_4_ * fVar284) * fVar284 + fVar284;
      fVar67 = (-fVar321 - auVar291._0_4_) * fVar261;
      fVar113 = (-fVar326 - auVar291._4_4_) * fVar273;
      fVar116 = (auVar292._8_4_ - auVar291._8_4_) * fVar279;
      fVar118 = (auVar292._12_4_ - auVar291._12_4_) * fVar284;
      fVar261 = (auVar291._0_4_ - fVar321) * fVar261;
      fVar273 = (auVar291._4_4_ - fVar326) * fVar273;
      fVar279 = (auVar291._8_4_ - fVar330) * fVar279;
      fVar284 = (auVar291._12_4_ - fVar333) * fVar284;
      auVar293._0_4_ = (fVar351 * fVar67 + fVar329) * fVar311;
      auVar293._4_4_ = (fVar354 * fVar113 + fVar332) * fVar314;
      auVar293._8_4_ = (fVar370 * fVar116 + fVar336) * fVar316;
      auVar293._12_4_ = (fVar375 * fVar118 + fVar347) * fVar369;
      auVar364._0_4_ = (fVar351 * fVar261 + fVar329) * fVar311;
      auVar364._4_4_ = (fVar354 * fVar273 + fVar332) * fVar314;
      auVar364._8_4_ = (fVar370 * fVar279 + fVar336) * fVar316;
      auVar364._12_4_ = (fVar375 * fVar284 + fVar347) * fVar369;
      auVar88._0_4_ = (uint)fVar67 & uVar63;
      auVar88._4_4_ = (uint)fVar113 & uVar64;
      auVar88._8_4_ = (uint)fVar116 & uVar66;
      auVar88._12_4_ = (uint)fVar118 & uVar112;
      auVar263._0_8_ = CONCAT44(~uVar64,~uVar63) & 0x7f8000007f800000;
      auVar263._8_4_ = ~uVar66 & 0x7f800000;
      auVar263._12_4_ = ~uVar112 & 0x7f800000;
      auVar263 = auVar263 | auVar88;
      auVar341._0_4_ = (uint)fVar261 & uVar63;
      auVar341._4_4_ = (uint)fVar273 & uVar64;
      auVar341._8_4_ = (uint)fVar279 & uVar66;
      auVar341._12_4_ = (uint)fVar284 & uVar112;
      auVar89._0_8_ = CONCAT44(~uVar64,~uVar63) & 0xff800000ff800000;
      auVar89._8_4_ = ~uVar66 & 0xff800000;
      auVar89._12_4_ = ~uVar112 & 0xff800000;
      auVar89 = auVar89 | auVar341;
      auVar25._4_4_ = fVar204;
      auVar25._0_4_ = fVar173;
      auVar25._8_4_ = fVar218;
      auVar25._12_4_ = fVar219;
      auVar175 = maxps(auVar25,auVar208);
      fVar67 = auVar175._0_4_ * 1.9073486e-06;
      fVar113 = auVar175._4_4_ * 1.9073486e-06;
      fVar116 = auVar175._8_4_ * 1.9073486e-06;
      fVar118 = auVar175._12_4_ * 1.9073486e-06;
      auVar342._0_4_ = -(uint)(fVar160 < fVar67 && 0.0 <= auVar307._0_4_);
      auVar342._4_4_ = -(uint)(fVar172 < fVar113 && 0.0 <= auVar307._4_4_);
      auVar342._8_4_ = -(uint)(fVar269 < fVar116 && 0.0 <= auVar307._8_4_);
      auVar342._12_4_ = -(uint)(fVar275 < fVar118 && 0.0 <= auVar307._12_4_);
      iVar44 = movmskps(iVar44,auVar342);
      if (iVar44 != 0) {
        auVar217._4_4_ = -(uint)(fVar113 <= fVar172);
        auVar217._0_4_ = -(uint)(fVar67 <= fVar160);
        auVar217._8_4_ = -(uint)(fVar116 <= fVar269);
        auVar217._12_4_ = -(uint)(fVar118 <= fVar275);
        uVar115 = -(uint)(fVar345 <= 0.0);
        uVar117 = -(uint)(fVar352 <= 0.0);
        uVar379 = -(uint)(fVar360 <= 0.0);
        uVar285 = -(uint)(fVar362 <= 0.0);
        auVar167._4_4_ = uVar117;
        auVar167._0_4_ = uVar115;
        auVar167._8_4_ = uVar379;
        auVar167._12_4_ = uVar285;
        auVar190._0_4_ = (uVar115 & 0xff800000 | ~uVar115 & 0x7f800000) & auVar342._0_4_;
        auVar190._4_4_ = (uVar117 & 0xff800000 | ~uVar117 & 0x7f800000) & auVar342._4_4_;
        auVar190._8_4_ = (uVar379 & 0xff800000 | ~uVar379 & 0x7f800000) & auVar342._8_4_;
        auVar190._12_4_ = (uVar285 & 0xff800000 | ~uVar285 & 0x7f800000) & auVar342._12_4_;
        auVar242._0_4_ = ~auVar342._0_4_ & auVar263._0_4_;
        auVar242._4_4_ = ~auVar342._4_4_ & auVar263._4_4_;
        auVar242._8_4_ = ~auVar342._8_4_ & auVar263._8_4_;
        auVar242._12_4_ = ~auVar342._12_4_ & auVar263._12_4_;
        auVar263 = auVar242 | auVar190;
        auVar191._0_8_ = CONCAT44(~uVar117,~uVar115) & 0xff800000ff800000;
        auVar191._8_4_ = ~uVar379 & 0xff800000;
        auVar191._12_4_ = ~uVar285 & 0xff800000;
        auVar200._0_8_ = CONCAT44(uVar117,uVar115) & 0x7f8000007f800000;
        auVar200._8_4_ = uVar379 & 0x7f800000;
        auVar200._12_4_ = uVar285 & 0x7f800000;
        auVar200 = auVar200 | auVar191;
        auVar201._0_4_ = auVar200._0_4_ & auVar342._0_4_;
        auVar201._4_4_ = auVar200._4_4_ & auVar342._4_4_;
        auVar201._8_4_ = auVar200._8_4_ & auVar342._8_4_;
        auVar201._12_4_ = auVar200._12_4_ & auVar342._12_4_;
        auVar344._0_4_ = ~auVar342._0_4_ & auVar89._0_4_;
        auVar344._4_4_ = ~auVar342._4_4_ & auVar89._4_4_;
        auVar344._8_4_ = ~auVar342._8_4_ & auVar89._8_4_;
        auVar344._12_4_ = ~auVar342._12_4_ & auVar89._12_4_;
        auVar89 = auVar344 | auVar201;
        auVar167 = auVar167 | auVar217;
        auVar198._4_4_ = auVar167._4_4_ & uVar64;
        auVar198._0_4_ = auVar167._0_4_ & uVar63;
        auVar198._8_4_ = auVar167._8_4_ & uVar66;
        auVar198._12_4_ = auVar167._12_4_ & uVar112;
      }
    }
    auVar199._0_4_ = (auVar198._0_4_ << 0x1f) >> 0x1f;
    auVar199._4_4_ = (auVar198._4_4_ << 0x1f) >> 0x1f;
    auVar199._8_4_ = (auVar198._8_4_ << 0x1f) >> 0x1f;
    auVar199._12_4_ = (auVar198._12_4_ << 0x1f) >> 0x1f;
    auVar199 = auVar199 & auVar135;
    iVar44 = movmskps(iVar44,auVar199);
    if (iVar44 == 0) {
LAB_002fe7d0:
      uVar56 = CONCAT44(uVar47,iVar44);
    }
    else {
      fVar345 = *(float *)(ray + k * 4 + 0x80);
      auVar209._0_4_ = fVar345 - fVar254;
      auVar209._4_4_ = auVar209._0_4_;
      auVar209._8_4_ = auVar209._0_4_;
      auVar209._12_4_ = auVar209._0_4_;
      auVar291 = minps(auVar209,auVar89);
      auVar27._4_4_ = fVar192;
      auVar27._0_4_ = fVar192;
      auVar27._8_4_ = fVar192;
      auVar27._12_4_ = fVar192;
      auVar343 = maxps(auVar27,auVar263);
      auVar90._0_4_ = fVar306 * fVar305 + fVar319 * fVar159;
      auVar90._4_4_ = fVar312 * fVar348 + fVar324 * fVar159;
      auVar90._8_4_ = fVar315 * fVar280 + fVar328 * fVar159;
      auVar90._12_4_ = fVar317 * fVar355 + fVar331 * fVar159;
      auVar358._0_4_ = fVar374 * fVar157 + auVar90._0_4_;
      auVar358._4_4_ = fVar380 * fVar157 + auVar90._4_4_;
      auVar358._8_4_ = fVar220 * fVar157 + auVar90._8_4_;
      auVar358._12_4_ = fVar222 * fVar157 + auVar90._12_4_;
      auVar175 = rcpps(auVar90,auVar358);
      fVar352 = auVar175._0_4_;
      fVar360 = auVar175._4_4_;
      fVar362 = auVar175._8_4_;
      fVar67 = auVar175._12_4_;
      uVar115 = (uint)DAT_01f46720;
      uVar117 = DAT_01f46720._4_4_;
      uVar379 = DAT_01f46720._8_4_;
      fVar113 = DAT_01f46720._12_4_;
      fVar334 = ((1.0 - auVar358._0_4_ * fVar352) * fVar352 + fVar352) *
                (float)((uint)(fVar334 * fVar374 + fVar221 * fVar306 + fVar377 * fVar319) ^ uVar115)
      ;
      fVar349 = ((1.0 - auVar358._4_4_ * fVar360) * fVar360 + fVar360) *
                (float)((uint)(fVar349 * fVar380 + fVar171 * fVar312 + fVar259 * fVar324) ^ uVar117)
      ;
      fVar352 = ((1.0 - auVar358._8_4_ * fVar362) * fVar362 + fVar362) *
                (float)((uint)(fVar356 * fVar220 + fVar287 * fVar315 + fVar320 * fVar328) ^ uVar379)
      ;
      fVar356 = ((1.0 - auVar358._12_4_ * fVar67) * fVar67 + fVar67) *
                (float)((uint)(fVar361 * fVar222 + fVar300 * fVar317 + fVar325 * fVar331) ^
                       (uint)fVar113);
      uVar63 = -(uint)(auVar358._0_4_ < 0.0 || ABS(auVar358._0_4_) < 1e-18);
      uVar64 = -(uint)(auVar358._4_4_ < 0.0 || ABS(auVar358._4_4_) < 1e-18);
      uVar66 = -(uint)(auVar358._8_4_ < 0.0 || ABS(auVar358._8_4_) < 1e-18);
      uVar112 = -(uint)(auVar358._12_4_ < 0.0 || ABS(auVar358._12_4_) < 1e-18);
      auVar239._0_8_ = CONCAT44(uVar64,uVar63) & 0xff800000ff800000;
      auVar239._8_4_ = uVar66 & 0xff800000;
      auVar239._12_4_ = uVar112 & 0xff800000;
      auVar91._0_4_ = ~uVar63 & (uint)fVar334;
      auVar91._4_4_ = ~uVar64 & (uint)fVar349;
      auVar91._8_4_ = ~uVar66 & (uint)fVar352;
      auVar91._12_4_ = ~uVar112 & (uint)fVar356;
      auVar343 = maxps(auVar343,auVar91 | auVar239);
      uVar63 = -(uint)(0.0 < auVar358._0_4_ || ABS(auVar358._0_4_) < 1e-18);
      uVar64 = -(uint)(0.0 < auVar358._4_4_ || ABS(auVar358._4_4_) < 1e-18);
      uVar66 = -(uint)(0.0 < auVar358._8_4_ || ABS(auVar358._8_4_) < 1e-18);
      uVar112 = -(uint)(0.0 < auVar358._12_4_ || ABS(auVar358._12_4_) < 1e-18);
      auVar92._0_8_ = CONCAT44(uVar64,uVar63) & 0x7f8000007f800000;
      auVar92._8_4_ = uVar66 & 0x7f800000;
      auVar92._12_4_ = uVar112 & 0x7f800000;
      auVar359._0_4_ = ~uVar63 & (uint)fVar334;
      auVar359._4_4_ = ~uVar64 & (uint)fVar349;
      auVar359._8_4_ = ~uVar66 & (uint)fVar352;
      auVar359._12_4_ = ~uVar112 & (uint)fVar356;
      auVar291 = minps(auVar291,auVar359 | auVar92);
      auVar137._0_4_ =
           (float)((uint)fVar380 ^ uVar115) * fVar157 +
           (float)((uint)fVar312 ^ uVar115) * fVar305 + (float)((uint)fVar324 ^ uVar115) * fVar159;
      auVar137._4_4_ =
           (float)((uint)fVar220 ^ uVar117) * fVar157 +
           (float)((uint)fVar315 ^ uVar117) * fVar348 + (float)((uint)fVar328 ^ uVar117) * fVar159;
      auVar137._8_4_ =
           (float)((uint)fVar222 ^ uVar379) * fVar157 +
           (float)((uint)fVar317 ^ uVar379) * fVar280 + (float)((uint)fVar331 ^ uVar379) * fVar159;
      auVar137._12_4_ = fVar113 * fVar157 + fVar113 * fVar355 + fVar113 * fVar159;
      auVar175 = rcpps(_local_5b8,auVar137);
      fVar334 = auVar175._0_4_;
      fVar349 = auVar175._4_4_;
      fVar352 = auVar175._8_4_;
      fVar356 = auVar175._12_4_;
      auVar179._4_4_ = -(uint)(ABS(auVar137._4_4_) < 1e-18);
      auVar179._0_4_ = -(uint)(ABS(auVar137._0_4_) < 1e-18);
      auVar179._8_4_ = -(uint)(ABS(auVar137._8_4_) < 1e-18);
      auVar179._12_4_ = -(uint)(ABS(auVar137._12_4_) < 1e-18);
      fVar334 = (((float)DAT_01f46a60 - auVar137._0_4_ * fVar334) * fVar334 + fVar334) *
                (float)((uint)((0.0 - fVar270) * (float)((uint)fVar380 ^ uVar115) +
                              (0.0 - fVar271) * (float)((uint)fVar312 ^ uVar115) +
                              (0.0 - fVar346) * (float)((uint)fVar324 ^ uVar115)) ^ uVar115);
      fVar349 = ((DAT_01f46a60._4_4_ - auVar137._4_4_ * fVar349) * fVar349 + fVar349) *
                (float)((uint)((0.0 - fVar276) * (float)((uint)fVar220 ^ uVar117) +
                              (0.0 - fVar277) * (float)((uint)fVar315 ^ uVar117) +
                              (0.0 - fVar350) * (float)((uint)fVar328 ^ uVar117)) ^ uVar117);
      fVar352 = ((DAT_01f46a60._8_4_ - auVar137._8_4_ * fVar352) * fVar352 + fVar352) *
                (float)((uint)((0.0 - fVar281) * (float)((uint)fVar222 ^ uVar379) +
                              (0.0 - fVar282) * (float)((uint)fVar317 ^ uVar379) +
                              (0.0 - fVar353) * (float)((uint)fVar331 ^ uVar379)) ^ uVar379);
      fVar356 = ((DAT_01f46a60._12_4_ - auVar137._12_4_ * fVar356) * fVar356 + fVar356) *
                (float)((uint)(fVar113 * 0.0 + fVar113 * 0.0 + fVar113 * 0.0) ^ (uint)fVar113);
      auVar93._4_4_ = -(uint)(auVar137._4_4_ < 0.0);
      auVar93._0_4_ = -(uint)(auVar137._0_4_ < 0.0);
      auVar93._8_4_ = -(uint)(auVar137._8_4_ < 0.0);
      auVar93._12_4_ = -(uint)(auVar137._12_4_ < 0.0);
      auVar93 = auVar93 | auVar179;
      auVar264._0_8_ = auVar93._0_8_ & 0xff800000ff800000;
      auVar264._8_4_ = auVar93._8_4_ & 0xff800000;
      auVar264._12_4_ = auVar93._12_4_ & 0xff800000;
      auVar94._0_4_ = ~auVar93._0_4_ & (uint)fVar334;
      auVar94._4_4_ = ~auVar93._4_4_ & (uint)fVar349;
      auVar94._8_4_ = ~auVar93._8_4_ & (uint)fVar352;
      auVar94._12_4_ = ~auVar93._12_4_ & (uint)fVar356;
      local_598 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar343,auVar94 | auVar264);
      auVar138._4_4_ = -(uint)(0.0 < auVar137._4_4_);
      auVar138._0_4_ = -(uint)(0.0 < auVar137._0_4_);
      auVar138._8_4_ = -(uint)(0.0 < auVar137._8_4_);
      auVar138._12_4_ = -(uint)(0.0 < auVar137._12_4_);
      auVar138 = auVar138 | auVar179;
      auVar95._0_8_ = auVar138._0_8_ & 0x7f8000007f800000;
      auVar95._8_4_ = auVar138._8_4_ & 0x7f800000;
      auVar95._12_4_ = auVar138._12_4_ & 0x7f800000;
      auVar139._0_4_ = ~auVar138._0_4_ & (uint)fVar334;
      auVar139._4_4_ = ~auVar138._4_4_ & (uint)fVar349;
      auVar139._8_4_ = ~auVar138._8_4_ & (uint)fVar352;
      auVar139._12_4_ = ~auVar138._12_4_ & (uint)fVar356;
      tp1.upper.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar291,auVar139 | auVar95);
      fVar356 = local_598.v[3];
      fVar334 = local_598.v[0];
      fVar349 = local_598.v[1];
      fVar352 = local_598.v[2];
      auVar140._0_4_ = -(uint)(fVar334 <= tp1.upper.field_0._0_4_) & auVar199._0_4_;
      auVar140._4_4_ = -(uint)(fVar349 <= tp1.upper.field_0._4_4_) & auVar199._4_4_;
      auVar140._8_4_ = -(uint)(fVar352 <= tp1.upper.field_0._8_4_) & auVar199._8_4_;
      auVar140._12_4_ = -(uint)(fVar356 <= tp1.upper.field_0._12_4_) & auVar199._12_4_;
      iVar44 = movmskps(iVar44,auVar140);
      if (iVar44 == 0) goto LAB_002fe7d0;
      auVar24._4_4_ = (auVar373._4_4_ - auVar69._4_4_) * 0.99999976;
      auVar24._0_4_ = (auVar373._0_4_ - auVar69._0_4_) * 0.99999976;
      auVar24._8_4_ = (auVar373._8_4_ - auVar69._8_4_) * 0.99999976;
      auVar24._12_4_ = (auVar373._12_4_ - auVar69._12_4_) * 0.99999976;
      auVar69 = maxps(ZEXT816(0),auVar24);
      auVar96._0_4_ = auVar69._0_4_ * auVar69._0_4_;
      auVar96._4_4_ = auVar69._4_4_ * auVar69._4_4_;
      auVar96._8_4_ = auVar69._8_4_ * auVar69._8_4_;
      auVar96._12_4_ = auVar69._12_4_ * auVar69._12_4_;
      auVar69 = minps(auVar293,_DAT_01f46a60);
      _local_648 = ZEXT812(0);
      fStack_63c = 0.0;
      auVar69 = maxps(auVar69,_local_648);
      auVar175 = minps(auVar364,_DAT_01f46a60);
      auVar175 = maxps(auVar175,_local_648);
      local_108[0] = (auVar69._0_4_ + 0.0) * 0.25 * fVar327 + (float)local_438._4_4_;
      local_108[1] = (auVar69._4_4_ + 1.0) * 0.25 * fVar327 + (float)local_438._4_4_;
      local_108[2] = (auVar69._8_4_ + 2.0) * 0.25 * fVar327 + (float)local_438._4_4_;
      local_108[3] = (auVar69._12_4_ + 3.0) * 0.25 * fVar327 + (float)local_438._4_4_;
      local_118[0] = (auVar175._0_4_ + 0.0) * 0.25 * fVar327 + (float)local_438._4_4_;
      local_118[1] = (auVar175._4_4_ + 1.0) * 0.25 * fVar327 + (float)local_438._4_4_;
      local_118[2] = (auVar175._8_4_ + 2.0) * 0.25 * fVar327 + (float)local_438._4_4_;
      local_118[3] = (auVar175._12_4_ + 3.0) * 0.25 * fVar327 + (float)local_438._4_4_;
      fVar169 = fVar169 - auVar96._0_4_;
      fVar256 = fVar256 - auVar96._4_4_;
      fVar297 = fVar297 - auVar96._8_4_;
      fVar302 = fVar302 - auVar96._12_4_;
      auVar294._0_4_ = fVar321 * fVar321 - fVar371 * 4.0 * fVar169;
      auVar294._4_4_ = fVar326 * fVar326 - fVar376 * 4.0 * fVar256;
      auVar294._8_4_ = fVar330 * fVar330 - fVar378 * 4.0 * fVar297;
      auVar294._12_4_ = fVar333 * fVar333 - fVar381 * 4.0 * fVar302;
      local_628._4_4_ = -(uint)(0.0 <= auVar294._4_4_);
      local_628._0_4_ = -(uint)(0.0 <= auVar294._0_4_);
      local_628._8_4_ = -(uint)(0.0 <= auVar294._8_4_);
      local_628._12_4_ = -(uint)(0.0 <= auVar294._12_4_);
      iVar44 = movmskps(iVar44,local_628);
      if (iVar44 == 0) {
        _local_658 = ZEXT816(0);
        fVar327 = 0.0;
        fVar360 = 0.0;
        fVar361 = 0.0;
        fVar362 = 0.0;
        fVar221 = 0.0;
        fVar171 = 0.0;
        fVar287 = 0.0;
        fVar300 = 0.0;
        _local_638 = ZEXT816(0);
        _local_5c8 = ZEXT816(0);
        iVar44 = 0;
        auVar97 = _DAT_01f45a40;
        auVar265 = _DAT_01f45a30;
      }
      else {
        auVar175 = sqrtps(_local_438,auVar294);
        auVar163._0_4_ = fVar371 + fVar371;
        auVar163._4_4_ = fVar376 + fVar376;
        auVar163._8_4_ = fVar378 + fVar378;
        auVar163._12_4_ = fVar381 + fVar381;
        auVar69 = rcpps(auVar96,auVar163);
        fVar374 = auVar69._0_4_;
        fVar377 = auVar69._4_4_;
        fVar380 = auVar69._8_4_;
        fVar259 = auVar69._12_4_;
        fVar374 = ((float)DAT_01f46a60 - auVar163._0_4_ * fVar374) * fVar374 + fVar374;
        fVar377 = (DAT_01f46a60._4_4_ - auVar163._4_4_ * fVar377) * fVar377 + fVar377;
        fVar380 = (DAT_01f46a60._8_4_ - auVar163._8_4_ * fVar380) * fVar380 + fVar380;
        fVar259 = (DAT_01f46a60._12_4_ - auVar163._12_4_ * fVar259) * fVar259 + fVar259;
        local_1e8 = (float)auVar292._0_8_;
        fStack_1e4 = (float)(auVar292._0_8_ >> 0x20);
        fVar220 = (local_1e8 - auVar175._0_4_) * fVar374;
        fVar320 = (fStack_1e4 - auVar175._4_4_) * fVar377;
        fVar222 = (auVar292._8_4_ - auVar175._8_4_) * fVar380;
        fVar325 = (auVar292._12_4_ - auVar175._12_4_) * fVar259;
        fVar374 = (auVar175._0_4_ - fVar321) * fVar374;
        fVar377 = (auVar175._4_4_ - fVar326) * fVar377;
        fVar380 = (auVar175._8_4_ - fVar330) * fVar380;
        fVar259 = (auVar175._12_4_ - fVar333) * fVar259;
        fVar327 = (fVar351 * fVar220 + fVar329) * fVar311;
        fVar360 = (fVar354 * fVar320 + fVar332) * fVar314;
        fVar361 = (fVar370 * fVar222 + fVar336) * fVar316;
        fVar362 = (fVar375 * fVar325 + fVar347) * fVar369;
        local_638._4_4_ = fVar157 * fVar320 - (fVar245 * fVar360 + fVar270);
        local_638._0_4_ = fVar157 * fVar220 - (fVar224 * fVar327 + fVar257);
        fStack_630 = fVar157 * fVar222 - (fVar247 * fVar361 + fVar276);
        fStack_62c = fVar157 * fVar325 - (fVar248 * fVar362 + fVar281);
        local_648._4_4_ = fVar348 * fVar320 - (auVar363._4_4_ * fVar360 + fVar271);
        local_648._0_4_ = fVar305 * fVar220 - (auVar363._0_4_ * fVar327 + fVar258);
        fStack_640 = fVar280 * fVar222 - (auVar363._8_4_ * fVar361 + fVar277);
        fStack_63c = fVar355 * fVar325 - (auVar363._12_4_ * fVar362 + fVar282);
        local_5c8._4_4_ = fVar159 * fVar320 - (fVar360 * fVar272 + fVar346);
        local_5c8._0_4_ = fVar159 * fVar220 - (fVar327 * fVar260 + fVar335);
        fStack_5c0 = fVar159 * fVar222 - (fVar361 * fVar278 + fVar350);
        fStack_5bc = fVar159 * fVar325 - (fVar362 * fVar283 + fVar353);
        fVar311 = (fVar351 * fVar374 + fVar329) * fVar311;
        fVar314 = (fVar354 * fVar377 + fVar332) * fVar314;
        fVar316 = (fVar370 * fVar380 + fVar336) * fVar316;
        fVar369 = (fVar375 * fVar259 + fVar347) * fVar369;
        local_658._4_4_ = fVar157 * fVar377 - (fVar245 * fVar314 + fVar270);
        local_658._0_4_ = fVar157 * fVar374 - (fVar224 * fVar311 + fVar257);
        fStack_650 = fVar157 * fVar380 - (fVar247 * fVar316 + fVar276);
        fStack_64c = fVar157 * fVar259 - (fVar248 * fVar369 + fVar281);
        fVar327 = fVar305 * fVar374 - (auVar363._0_4_ * fVar311 + fVar258);
        fVar360 = fVar348 * fVar377 - (auVar363._4_4_ * fVar314 + fVar271);
        fVar361 = fVar280 * fVar380 - (auVar363._8_4_ * fVar316 + fVar277);
        fVar362 = fVar355 * fVar259 - (auVar363._12_4_ * fVar369 + fVar282);
        bVar60 = 0.0 <= auVar294._0_4_;
        uVar63 = -(uint)bVar60;
        bVar12 = 0.0 <= auVar294._4_4_;
        uVar64 = -(uint)bVar12;
        bVar13 = 0.0 <= auVar294._8_4_;
        uVar66 = -(uint)bVar13;
        bVar14 = 0.0 <= auVar294._12_4_;
        uVar112 = -(uint)bVar14;
        fVar221 = fVar159 * fVar374 - (fVar311 * fVar260 + fVar335);
        fVar171 = fVar159 * fVar377 - (fVar314 * fVar272 + fVar346);
        fVar287 = fVar159 * fVar380 - (fVar316 * fVar278 + fVar350);
        fVar300 = fVar159 * fVar259 - (fVar369 * fVar283 + fVar353);
        auVar164._0_4_ = (uint)fVar220 & uVar63;
        auVar164._4_4_ = (uint)fVar320 & uVar64;
        auVar164._8_4_ = (uint)fVar222 & uVar66;
        auVar164._12_4_ = (uint)fVar325 & uVar112;
        auVar265._0_8_ = CONCAT44(~uVar64,~uVar63) & 0x7f8000007f800000;
        auVar265._8_4_ = ~uVar66 & 0x7f800000;
        auVar265._12_4_ = ~uVar112 & 0x7f800000;
        auVar265 = auVar265 | auVar164;
        auVar240._0_4_ = (uint)fVar374 & uVar63;
        auVar240._4_4_ = (uint)fVar377 & uVar64;
        auVar240._8_4_ = (uint)fVar380 & uVar66;
        auVar240._12_4_ = (uint)fVar259 & uVar112;
        auVar97._0_8_ = CONCAT44(~uVar64,~uVar63) & 0xff800000ff800000;
        auVar97._8_4_ = ~uVar66 & 0xff800000;
        auVar97._12_4_ = ~uVar112 & 0xff800000;
        auVar97 = auVar97 | auVar240;
        auVar26._4_4_ = fVar204;
        auVar26._0_4_ = fVar173;
        auVar26._8_4_ = fVar218;
        auVar26._12_4_ = fVar219;
        auVar69 = maxps(auVar26,auVar178);
        fVar311 = auVar69._0_4_ * 1.9073486e-06;
        fVar314 = auVar69._4_4_ * 1.9073486e-06;
        fVar316 = auVar69._8_4_ * 1.9073486e-06;
        fVar369 = auVar69._12_4_ * 1.9073486e-06;
        auVar241._0_4_ = -(uint)(fVar160 < fVar311 && bVar60);
        auVar241._4_4_ = -(uint)(fVar172 < fVar314 && bVar12);
        auVar241._8_4_ = -(uint)(fVar269 < fVar316 && bVar13);
        auVar241._12_4_ = -(uint)(fVar275 < fVar369 && bVar14);
        iVar44 = movmskps(iVar44,auVar241);
        if (iVar44 != 0) {
          uVar63 = -(uint)(fVar169 <= 0.0);
          uVar64 = -(uint)(fVar256 <= 0.0);
          uVar66 = -(uint)(fVar297 <= 0.0);
          uVar112 = -(uint)(fVar302 <= 0.0);
          auVar295._0_4_ = (uVar63 & 0xff800000 | ~uVar63 & 0x7f800000) & auVar241._0_4_;
          auVar295._4_4_ = (uVar64 & 0xff800000 | ~uVar64 & 0x7f800000) & auVar241._4_4_;
          auVar295._8_4_ = (uVar66 & 0xff800000 | ~uVar66 & 0x7f800000) & auVar241._8_4_;
          auVar295._12_4_ = (uVar112 & 0xff800000 | ~uVar112 & 0x7f800000) & auVar241._12_4_;
          auVar322._0_4_ = ~auVar241._0_4_ & auVar265._0_4_;
          auVar322._4_4_ = ~auVar241._4_4_ & auVar265._4_4_;
          auVar322._8_4_ = ~auVar241._8_4_ & auVar265._8_4_;
          auVar322._12_4_ = ~auVar241._12_4_ & auVar265._12_4_;
          auVar267._0_4_ = (uVar63 & 0x7f800000 | ~uVar63 & 0xff800000) & auVar241._0_4_;
          auVar267._4_4_ = (uVar64 & 0x7f800000 | ~uVar64 & 0xff800000) & auVar241._4_4_;
          auVar267._8_4_ = (uVar66 & 0x7f800000 | ~uVar66 & 0xff800000) & auVar241._8_4_;
          auVar267._12_4_ = (uVar112 & 0x7f800000 | ~uVar112 & 0xff800000) & auVar241._12_4_;
          auVar243._0_4_ = ~auVar241._0_4_ & auVar97._0_4_;
          auVar243._4_4_ = ~auVar241._4_4_ & auVar97._4_4_;
          auVar243._8_4_ = ~auVar241._8_4_ & auVar97._8_4_;
          auVar243._12_4_ = ~auVar241._12_4_ & auVar97._12_4_;
          local_628._4_4_ = -(uint)((fVar314 <= fVar172 || fVar256 <= 0.0) && bVar12);
          local_628._0_4_ = -(uint)((fVar311 <= fVar160 || fVar169 <= 0.0) && bVar60);
          local_628._8_4_ = -(uint)((fVar316 <= fVar269 || fVar297 <= 0.0) && bVar13);
          local_628._12_4_ = -(uint)((fVar369 <= fVar275 || fVar302 <= 0.0) && bVar14);
          auVar97 = auVar243 | auVar267;
          auVar265 = auVar322 | auVar295;
        }
      }
      uVar288 = (uint)DAT_01f46710;
      uVar298 = DAT_01f46710._4_4_;
      uVar301 = DAT_01f46710._8_4_;
      uVar303 = DAT_01f46710._12_4_;
      fVar160 = (float)DAT_01f4be20;
      fVar169 = DAT_01f4be20._4_4_;
      fVar172 = DAT_01f4be20._8_4_;
      fVar256 = DAT_01f4be20._12_4_;
      auVar69 = minps((undefined1  [16])tp1.upper.field_0,auVar265);
      aVar266 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                maxps((undefined1  [16])local_598,auVar97);
      tp1.lower.field_0 = aVar266;
      uVar63 = -(uint)(fVar334 <= auVar69._0_4_) & auVar140._0_4_;
      uVar64 = -(uint)(fVar349 <= auVar69._4_4_) & auVar140._4_4_;
      uVar68 = CONCAT44(uVar64,uVar63);
      uVar66 = -(uint)(fVar352 <= auVar69._8_4_) & auVar140._8_4_;
      uVar112 = -(uint)(fVar356 <= auVar69._12_4_) & auVar140._12_4_;
      uVar115 = -(uint)(aVar266.v[0] <= tp1.upper.field_0._0_4_) & auVar140._0_4_;
      uVar117 = -(uint)(aVar266.v[1] <= tp1.upper.field_0._4_4_) & auVar140._4_4_;
      auVar98._4_4_ = uVar117;
      auVar98._0_4_ = uVar115;
      uVar379 = -(uint)(aVar266.v[2] <= tp1.upper.field_0._8_4_) & auVar140._8_4_;
      uVar285 = -(uint)(aVar266.v[3] <= tp1.upper.field_0._12_4_) & auVar140._12_4_;
      auVar141._8_4_ = uVar66;
      auVar141._0_8_ = uVar68;
      auVar141._12_4_ = uVar112;
      auVar98._8_4_ = uVar379;
      auVar98._12_4_ = uVar285;
      iVar44 = movmskps(iVar44,auVar98 | auVar141);
      uVar56 = CONCAT44(uVar47,iVar44);
      if (iVar44 != 0) {
        auVar210._8_4_ = uVar66;
        auVar210._0_8_ = uVar68;
        auVar210._12_4_ = uVar112;
        local_5c8._0_4_ =
             -(uint)((int)local_6bc <
                    ((int)((-(uint)(fVar160 <=
                                   (float)((uint)((float)local_5c8._0_4_ * fVar159 +
                                                  local_648._0_4_ * fVar305 +
                                                 (float)local_638._0_4_ * fVar157) & uVar288)) &
                           local_628._0_4_) << 0x1f) >> 0x1f) + 4);
        local_5c8._4_4_ =
             -(uint)((int)local_6bc <
                    ((int)((-(uint)(fVar169 <=
                                   (float)((uint)((float)local_5c8._4_4_ * fVar159 +
                                                  local_648._4_4_ * fVar348 +
                                                 (float)local_638._4_4_ * fVar157) & uVar298)) &
                           local_628._4_4_) << 0x1f) >> 0x1f) + 4);
        fStack_5c0 = (float)-(uint)((int)local_6bc <
                                   ((int)((-(uint)(fVar172 <=
                                                  (float)((uint)(fStack_5c0 * fVar159 +
                                                                 local_648._8_4_ * fVar280 +
                                                                fStack_630 * fVar157) & uVar301)) &
                                          local_628._8_4_) << 0x1f) >> 0x1f) + 4);
        fStack_5bc = (float)-(uint)((int)local_6bc <
                                   ((int)((-(uint)(fVar256 <=
                                                  (float)((uint)(fStack_5bc * fVar159 +
                                                                 local_648._12_4_ * fVar355 +
                                                                fStack_62c * fVar157) & uVar303)) &
                                          local_628._12_4_) << 0x1f) >> 0x1f) + 4);
        auVar99 = ~_local_5c8 & auVar210;
        local_5a8 = fVar254 + fVar334;
        fStack_5a4 = fVar254 + fVar349;
        fStack_5a0 = fVar254 + fVar352;
        fStack_59c = fVar254 + fVar356;
        auVar69 = _DAT_01f46710;
        while( true ) {
          local_2f8 = auVar99;
          uVar47 = (undefined4)(uVar56 >> 0x20);
          iVar44 = movmskps((int)uVar56,auVar99);
          lVar50 = CONCAT44(uVar47,iVar44);
          if (iVar44 == 0) break;
          auVar291 = ~auVar99 & _DAT_01f45a30 | auVar99 & (undefined1  [16])local_598;
          auVar180._4_4_ = auVar291._0_4_;
          auVar180._0_4_ = auVar291._4_4_;
          auVar180._8_4_ = auVar291._12_4_;
          auVar180._12_4_ = auVar291._8_4_;
          auVar175 = minps(auVar180,auVar291);
          auVar142._0_8_ = auVar175._8_8_;
          auVar142._8_4_ = auVar175._0_4_;
          auVar142._12_4_ = auVar175._4_4_;
          auVar175 = minps(auVar142,auVar175);
          auVar143._0_8_ =
               CONCAT44(-(uint)(auVar175._4_4_ == auVar291._4_4_) & auVar99._4_4_,
                        -(uint)(auVar175._0_4_ == auVar291._0_4_) & auVar99._0_4_);
          auVar143._8_4_ = -(uint)(auVar175._8_4_ == auVar291._8_4_) & auVar99._8_4_;
          auVar143._12_4_ = -(uint)(auVar175._12_4_ == auVar291._12_4_) & auVar99._12_4_;
          iVar44 = movmskps(iVar44,auVar143);
          if (iVar44 != 0) {
            auVar99._8_4_ = auVar143._8_4_;
            auVar99._0_8_ = auVar143._0_8_;
            auVar99._12_4_ = auVar143._12_4_;
          }
          uVar45 = movmskps(iVar44,auVar99);
          uVar58 = CONCAT44(uVar47,uVar45);
          uVar56 = 0;
          if (uVar58 != 0) {
            for (; (uVar58 >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
            }
          }
          *(undefined4 *)(local_2f8 + uVar56 * 4) = 0;
          auVar22._4_4_ = fVar202;
          auVar22._0_4_ = fVar194;
          auVar22._8_4_ = fVar203;
          auVar22._12_4_ = fVar223;
          auVar20._4_4_ = fVar246;
          auVar20._0_4_ = fVar244;
          auVar20._8_4_ = fVar268;
          auVar20._12_4_ = fVar274;
          auVar291 = minps(auVar22,auVar20);
          auVar373 = maxps(auVar22,auVar20);
          auVar18._4_4_ = fVar310;
          auVar18._0_4_ = fVar304;
          auVar18._8_4_ = fVar313;
          auVar18._12_4_ = fVar318;
          auVar16._4_4_ = fVar249;
          auVar16._0_4_ = fVar255;
          auVar16._8_4_ = fVar253;
          auVar16._12_4_ = fVar323;
          auVar175 = minps(auVar18,auVar16);
          auVar291 = minps(auVar291,auVar175);
          auVar175 = maxps(auVar18,auVar16);
          auVar373 = maxps(auVar373,auVar175);
          auVar181._0_4_ = auVar291._0_4_ & auVar69._0_4_;
          auVar181._4_4_ = auVar291._4_4_ & auVar69._4_4_;
          auVar181._8_4_ = auVar291._8_4_ & auVar69._8_4_;
          auVar181._12_4_ = auVar291._12_4_ & auVar69._12_4_;
          auVar100._0_4_ = auVar373._0_4_ & auVar69._0_4_;
          auVar100._4_4_ = auVar373._4_4_ & auVar69._4_4_;
          auVar100._8_4_ = auVar373._8_4_ & auVar69._8_4_;
          auVar100._12_4_ = (uint)auVar373._12_4_ & auVar69._12_4_;
          auVar175 = maxps(auVar181,auVar100);
          fVar345 = auVar175._4_4_;
          if (auVar175._4_4_ <= auVar175._0_4_) {
            fVar345 = auVar175._0_4_;
          }
          auVar182._8_8_ = auVar175._8_8_;
          auVar182._0_8_ = auVar175._8_8_;
          if (auVar175._8_4_ <= fVar345) {
            auVar182._0_4_ = fVar345;
          }
          fVar297 = auVar182._0_4_ * 1.9073486e-06;
          fVar345 = local_108[uVar56];
          fVar269 = local_118[uVar56 - 8];
          for (uVar58 = 0; uVar58 != 5; uVar58 = uVar58 + 1) {
            fVar302 = SQRT(fVar170) * 1.9073486e-06 * fVar269;
            fVar314 = 1.0 - fVar345;
            fVar311 = fVar345 * 3.0;
            fVar275 = -fVar345 * fVar314 * fVar314 * 0.5;
            fVar369 = (fVar345 * fVar345 * (fVar311 + -5.0) + 2.0) * 0.5;
            fVar316 = ((fVar314 * 3.0 + -5.0) * fVar314 * fVar314 + 2.0) * 0.5;
            fVar374 = -fVar314 * fVar345 * fVar345 * 0.5;
            local_588 = fVar275 * fVar194 +
                        fVar369 * fVar244 + fVar316 * fVar304 + fVar374 * fVar255;
            fStack_584 = fVar275 * fVar202 +
                         fVar369 * fVar246 + fVar316 * fVar310 + fVar374 * fVar249;
            fStack_580 = fVar275 * fVar203 +
                         fVar369 * fVar268 + fVar316 * fVar313 + fVar374 * fVar253;
            fStack_57c = fVar275 * fVar223 +
                         fVar369 * fVar274 + fVar316 * fVar318 + fVar374 * fVar323;
            fVar374 = (fVar345 * (fVar314 + fVar314) - fVar314 * fVar314) * 0.5;
            fVar369 = ((fVar345 + fVar345) * (fVar311 + -5.0) + fVar345 * fVar311) * 0.5;
            fVar316 = ((fVar311 + 2.0) * (fVar314 + fVar314) + fVar314 * -3.0 * fVar314) * 0.5;
            fVar275 = (fVar314 * -2.0 * fVar345 + fVar345 * fVar345) * 0.5;
            fVar320 = fVar374 * fVar194 + fVar369 * fVar244 + fVar316 * fVar304 + fVar275 * fVar255;
            fVar222 = fVar374 * fVar202 + fVar369 * fVar246 + fVar316 * fVar310 + fVar275 * fVar249;
            fVar325 = fVar374 * fVar203 + fVar369 * fVar268 + fVar316 * fVar313 + fVar275 * fVar253;
            fVar224 = fVar374 * fVar223 + fVar369 * fVar274 + fVar316 * fVar318 + fVar275 * fVar323;
            fVar314 = fVar345 * -3.0 + 2.0;
            fVar369 = fVar345 * 9.0 + -5.0;
            fVar275 = fVar345 * -9.0 + 4.0;
            fVar311 = fVar311 + -1.0;
            fVar316 = fVar314 * fVar194 + fVar369 * fVar244 + fVar275 * fVar304 + fVar311 * fVar255;
            fVar374 = fVar314 * fVar202 + fVar369 * fVar246 + fVar275 * fVar310 + fVar311 * fVar249;
            fVar380 = fVar314 * fVar203 + fVar369 * fVar268 + fVar275 * fVar313 + fVar311 * fVar253;
            fVar369 = (fVar269 * dir.field_0.m128[0] + 0.0) - local_588;
            fVar377 = (fVar269 * dir.field_0.m128[1] + 0.0) - fStack_584;
            fVar259 = (fVar269 * dir.field_0.m128[2] + 0.0) - fStack_580;
            fVar220 = (fVar269 * dir.field_0.m128[3] + 0.0) - fStack_57c;
            fVar275 = fVar377 * fVar377;
            fVar311 = fVar259 * fVar259;
            fVar314 = fVar220 * fVar220;
            auVar308._0_4_ = fVar275 + fVar369 * fVar369 + fVar311;
            auVar308._4_4_ = fVar275 + fVar275 + fVar314;
            auVar308._8_4_ = fVar275 + fVar311 + fVar311;
            auVar308._12_4_ = fVar275 + fVar314 + fVar314;
            fVar275 = fVar297;
            if (fVar297 <= fVar302) {
              fVar275 = fVar302;
            }
            fVar311 = fVar222 * fVar222 + fVar320 * fVar320 + fVar325 * fVar325;
            auVar175 = ZEXT416((uint)fVar311);
            auVar69 = rsqrtss(ZEXT416((uint)fVar311),auVar175);
            fVar302 = auVar69._0_4_;
            fVar314 = fVar302 * 1.5 - fVar302 * fVar302 * fVar311 * 0.5 * fVar302;
            fVar336 = fVar320 * fVar314;
            fVar248 = fVar222 * fVar314;
            fVar347 = fVar325 * fVar314;
            fVar351 = fVar224 * fVar314;
            fVar247 = fVar380 * fVar325 + fVar374 * fVar222 + fVar316 * fVar320;
            auVar69 = rcpss(auVar175,auVar175);
            fVar302 = (2.0 - fVar311 * auVar69._0_4_) * auVar69._0_4_;
            fVar329 = fVar377 * fVar248;
            fVar245 = fVar259 * fVar347;
            fVar332 = fVar220 * fVar351;
            fVar354 = fVar329 + fVar369 * fVar336 + fVar245;
            fVar370 = fVar329 + fVar329 + fVar332;
            fVar245 = fVar329 + fVar245 + fVar245;
            fVar332 = fVar329 + fVar332 + fVar332;
            fVar257 = (SQRT(auVar308._0_4_) + 1.0) * (fVar297 / SQRT(fVar311)) +
                      SQRT(auVar308._0_4_) * fVar297 + fVar275;
            fVar375 = dir.field_0.m128[3] * fVar351;
            fVar351 = fVar351 * -fVar224;
            fVar314 = fVar347 * -fVar325 + fVar248 * -fVar222 + fVar336 * -fVar320 +
                      fVar302 * (fVar311 * fVar380 - fVar247 * fVar325) * fVar314 * fVar259 +
                      fVar302 * (fVar311 * fVar374 - fVar247 * fVar222) * fVar314 * fVar377 +
                      fVar302 * (fVar311 * fVar316 - fVar247 * fVar320) * fVar314 * fVar369;
            fVar329 = dir.field_0.m128[2] * fVar347 +
                      dir.field_0.m128[1] * fVar248 + dir.field_0.m128[0] * fVar336;
            fVar302 = auVar308._0_4_ - fVar354 * fVar354;
            auVar101._0_8_ = CONCAT44(auVar308._4_4_ - fVar370 * fVar370,fVar302);
            auVar101._8_4_ = auVar308._8_4_ - fVar245 * fVar245;
            auVar101._12_4_ = auVar308._12_4_ - fVar332 * fVar332;
            fVar245 = -fVar224 * fVar220;
            local_678 = CONCAT44(fVar351,fVar314);
            fVar316 = dir.field_0.m128[0] * fVar369;
            fVar374 = dir.field_0.m128[1] * fVar377;
            fVar380 = dir.field_0.m128[2] * fVar259;
            fVar220 = dir.field_0.m128[3] * fVar220;
            auVar144._8_4_ = auVar101._8_4_;
            auVar144._0_8_ = auVar101._0_8_;
            auVar144._12_4_ = auVar101._12_4_;
            auVar69 = rsqrtss(auVar144,auVar101);
            fVar311 = auVar69._0_4_;
            fVar311 = fVar311 * 1.5 - fVar311 * fVar311 * fVar302 * 0.5 * fVar311;
            if (fVar302 < 0.0) {
              fVar302 = sqrtf(fVar302);
              uVar56 = extraout_RAX;
              _Var53 = extraout_RDX;
            }
            else {
              fVar302 = SQRT(fVar302);
            }
            fVar302 = fVar302 - fStack_57c;
            fVar332 = ((-fVar325 * fVar259 + -fVar222 * fVar377 + -fVar320 * fVar369) -
                      fVar354 * fVar314) * fVar311 - fVar224;
            fVar311 = ((fVar380 + fVar374 + fVar316) - fVar354 * fVar329) * fVar311;
            auVar366._0_8_ = CONCAT44(fVar245,fVar332) ^ 0x8000000080000000;
            auVar183._0_4_ = fVar314 * fVar311 - fVar329 * fVar332;
            auVar366._8_4_ = -fVar245;
            auVar366._12_4_ = fVar220;
            auVar365._8_8_ = auVar366._8_8_;
            auVar365._0_8_ = CONCAT44(fVar311,fVar332) ^ 0x80000000;
            auVar183._4_4_ = auVar183._0_4_;
            auVar183._8_4_ = auVar183._0_4_;
            auVar183._12_4_ = auVar183._0_4_;
            auVar175 = divps(auVar365,auVar183);
            auVar212._8_4_ = fVar351;
            auVar212._0_8_ = local_678;
            auVar212._12_4_ = -fVar375;
            auVar211._8_8_ = auVar212._8_8_;
            auVar211._0_8_ = CONCAT44(fVar329,fVar314) ^ 0x8000000000000000;
            auVar69 = divps(auVar211,auVar183);
            fVar269 = fVar269 - (fVar302 * auVar69._0_4_ + fVar354 * auVar175._0_4_);
            fVar345 = fVar345 - (fVar302 * auVar69._4_4_ + fVar354 * auVar175._4_4_);
            auVar69 = _DAT_01f46710;
            if (((float)((uint)fVar354 & (uint)DAT_01f46710) < fVar257) &&
               ((float)((uint)fVar302 & (uint)DAT_01f46710) <
                auVar373._12_4_ * 1.9073486e-06 + fVar275 + fVar257)) {
              bVar60 = uVar58 < 5;
              fVar269 = fVar254 + fVar269;
              if (fVar269 < fVar158) {
                uVar56 = 0;
              }
              else {
                fVar297 = *(float *)(ray + k * 4 + 0x80);
                if (fVar269 <= fVar297) {
                  uVar56 = 0;
                  if ((0.0 <= fVar345) && (fVar345 <= 1.0)) {
                    auVar175 = rsqrtss(auVar308,auVar308);
                    fVar275 = auVar175._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_5d0].ptr;
                    _Var53 = local_5d0;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      uVar56 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (uVar56 = CONCAT71((int7)((ulong)context->args >> 8),1),
                            pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      fVar275 = fVar275 * 1.5 + fVar275 * fVar275 * auVar308._0_4_ * -0.5 * fVar275;
                      fVar369 = fVar369 * fVar275;
                      fVar377 = fVar377 * fVar275;
                      fVar259 = fVar259 * fVar275;
                      fVar275 = fVar224 * fVar369 + fVar320;
                      fVar302 = fVar224 * fVar377 + fVar222;
                      fVar311 = fVar224 * fVar259 + fVar325;
                      fVar314 = fVar377 * fVar320 - fVar222 * fVar369;
                      fVar316 = fVar259 * fVar222 - fVar325 * fVar377;
                      fVar369 = fVar369 * fVar325 - fVar320 * fVar259;
                      local_2c8 = fVar316 * fVar302 - fVar369 * fVar275;
                      local_2e8._4_4_ = fVar369 * fVar311 - fVar314 * fVar302;
                      local_2d8 = fVar314 * fVar275 - fVar316 * fVar311;
                      local_2e8._0_4_ = local_2e8._4_4_;
                      fStack_2e0 = (float)local_2e8._4_4_;
                      fStack_2dc = (float)local_2e8._4_4_;
                      fStack_2d4 = local_2d8;
                      fStack_2d0 = local_2d8;
                      fStack_2cc = local_2d8;
                      fStack_2c4 = local_2c8;
                      fStack_2c0 = local_2c8;
                      fStack_2bc = local_2c8;
                      local_2b8 = fVar345;
                      fStack_2b4 = fVar345;
                      fStack_2b0 = fVar345;
                      fStack_2ac = fVar345;
                      local_2a8 = 0;
                      uStack_2a4 = 0;
                      uStack_2a0 = 0;
                      uStack_29c = 0;
                      local_298 = CONCAT44(uVar62,uVar62);
                      uStack_290 = CONCAT44(uVar62,uVar62);
                      local_288 = CONCAT44(uVar61,uVar61);
                      uStack_280 = CONCAT44(uVar61,uVar61);
                      local_278 = context->user->instID[0];
                      uStack_274 = local_278;
                      uStack_270 = local_278;
                      uStack_26c = local_278;
                      local_268 = context->user->instPrimID[0];
                      uStack_264 = local_268;
                      uStack_260 = local_268;
                      uStack_25c = local_268;
                      *(float *)(ray + k * 4 + 0x80) = fVar269;
                      local_5e8 = *(undefined1 (*) [16])
                                   (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                      args.valid = (int *)local_5e8;
                      args.geometryUserPtr = pGVar9->userPtr;
                      args.context = context->user;
                      args.ray = (RTCRayN *)ray;
                      args.hit = (RTCHitN *)local_2e8;
                      args.N = 4;
                      p_Var10 = pGVar9->occlusionFilterN;
                      auVar382._8_8_ = &local_278;
                      auVar382._0_8_ = p_Var10;
                      if (p_Var10 != (RTCFilterFunctionN)0x0) {
                        auVar382 = (*p_Var10)(&args);
                      }
                      _Var53 = auVar382._8_8_;
                      auVar145._0_4_ = -(uint)(local_5e8._0_4_ == 0);
                      auVar145._4_4_ = -(uint)(local_5e8._4_4_ == 0);
                      auVar145._8_4_ = -(uint)(local_5e8._8_4_ == 0);
                      auVar145._12_4_ = -(uint)(local_5e8._12_4_ == 0);
                      uVar46 = movmskps(auVar382._0_4_,auVar145);
                      pRVar49 = (RTCRayN *)(ulong)(uVar46 ^ 0xf);
                      if ((uVar46 ^ 0xf) == 0) {
                        auVar145 = auVar145 ^ _DAT_01f46b70;
                        auVar69 = _DAT_01f46710;
                      }
                      else {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var10)(&args);
                          _Var53 = extraout_RDX_00;
                        }
                        auVar69 = _DAT_01f46710;
                        auVar102._0_4_ = -(uint)(local_5e8._0_4_ == 0);
                        auVar102._4_4_ = -(uint)(local_5e8._4_4_ == 0);
                        auVar102._8_4_ = -(uint)(local_5e8._8_4_ == 0);
                        auVar102._12_4_ = -(uint)(local_5e8._12_4_ == 0);
                        auVar145 = auVar102 ^ _DAT_01f46b70;
                        *(undefined1 (*) [16])(args.ray + 0x80) =
                             ~auVar102 & _DAT_01f45a40 |
                             *(undefined1 (*) [16])(args.ray + 0x80) & auVar102;
                        pRVar49 = args.ray;
                      }
                      auVar146._0_4_ = auVar145._0_4_ << 0x1f;
                      auVar146._4_4_ = auVar145._4_4_ << 0x1f;
                      auVar146._8_4_ = auVar145._8_4_ << 0x1f;
                      auVar146._12_4_ = auVar145._12_4_ << 0x1f;
                      iVar44 = movmskps((int)pRVar49,auVar146);
                      uVar56 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar49 >> 0x20),iVar44) >> 8),
                                        iVar44 != 0);
                      if (iVar44 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar297;
                      }
                    }
                  }
                }
                else {
                  uVar56 = 0;
                }
              }
              goto LAB_002ff07d;
            }
          }
          bVar60 = false;
LAB_002ff07d:
          bVar54 = bVar54 | bVar60 & (byte)uVar56;
          fVar345 = *(float *)(ray + k * 4 + 0x80);
          auVar99._0_4_ = -(uint)(local_5a8 <= fVar345) & local_2f8._0_4_;
          auVar99._4_4_ = -(uint)(fStack_5a4 <= fVar345) & local_2f8._4_4_;
          auVar99._8_4_ = -(uint)(fStack_5a0 <= fVar345) & local_2f8._8_4_;
          auVar99._12_4_ = -(uint)(fStack_59c <= fVar345) & local_2f8._12_4_;
        }
        auVar165._0_4_ = -(uint)(aVar266.v[0] + fVar254 <= fVar345) & uVar115;
        auVar165._4_4_ = -(uint)(aVar266.v[1] + fVar254 <= fVar345) & uVar117;
        auVar165._8_4_ = -(uint)(aVar266.v[2] + fVar254 <= fVar345) & uVar379;
        auVar165._12_4_ = -(uint)(aVar266.v[3] + fVar254 <= fVar345) & uVar285;
        auVar103._0_4_ =
             -(uint)((int)local_6bc <
                    ((int)((-(uint)(fVar160 <=
                                   (float)((uint)((float)local_658._0_4_ * fVar157 +
                                                 fVar327 * fVar305 + fVar221 * fVar159) & uVar288))
                           & local_628._0_4_) << 0x1f) >> 0x1f) + 4);
        auVar103._4_4_ =
             -(uint)((int)local_6bc <
                    ((int)((-(uint)(fVar169 <=
                                   (float)((uint)((float)local_658._4_4_ * fVar157 +
                                                 fVar360 * fVar348 + fVar171 * fVar159) & uVar298))
                           & local_628._4_4_) << 0x1f) >> 0x1f) + 4);
        auVar103._8_4_ =
             -(uint)((int)local_6bc <
                    ((int)((-(uint)(fVar172 <=
                                   (float)((uint)(fStack_650 * fVar157 +
                                                 fVar361 * fVar280 + fVar287 * fVar159) & uVar301))
                           & local_628._8_4_) << 0x1f) >> 0x1f) + 4);
        auVar103._12_4_ =
             -(uint)((int)local_6bc <
                    ((int)((-(uint)(fVar256 <=
                                   (float)((uint)(fStack_64c * fVar157 +
                                                 fVar362 * fVar355 + fVar300 * fVar159) & uVar303))
                           & local_628._12_4_) << 0x1f) >> 0x1f) + 4);
        auVar104 = ~auVar103 & auVar165;
        local_598 = tp1.lower.field_0;
        local_5a8 = fVar254 + tp1.lower.field_0.v[0];
        fStack_5a4 = fVar254 + tp1.lower.field_0.v[1];
        fStack_5a0 = fVar254 + tp1.lower.field_0.v[2];
        fStack_59c = fVar254 + tp1.lower.field_0.v[3];
        while( true ) {
          local_308 = auVar104;
          iVar44 = movmskps((int)lVar50,auVar104);
          if (iVar44 == 0) break;
          auVar291 = ~auVar104 & _DAT_01f45a30 | auVar104 & (undefined1  [16])local_598;
          auVar184._4_4_ = auVar291._0_4_;
          auVar184._0_4_ = auVar291._4_4_;
          auVar184._8_4_ = auVar291._12_4_;
          auVar184._12_4_ = auVar291._8_4_;
          auVar175 = minps(auVar184,auVar291);
          auVar147._0_8_ = auVar175._8_8_;
          auVar147._8_4_ = auVar175._0_4_;
          auVar147._12_4_ = auVar175._4_4_;
          auVar175 = minps(auVar147,auVar175);
          auVar148._0_8_ =
               CONCAT44(-(uint)(auVar175._4_4_ == auVar291._4_4_) & auVar104._4_4_,
                        -(uint)(auVar175._0_4_ == auVar291._0_4_) & auVar104._0_4_);
          auVar148._8_4_ = -(uint)(auVar175._8_4_ == auVar291._8_4_) & auVar104._8_4_;
          auVar148._12_4_ = -(uint)(auVar175._12_4_ == auVar291._12_4_) & auVar104._12_4_;
          iVar44 = movmskps(iVar44,auVar148);
          if (iVar44 != 0) {
            auVar104._8_4_ = auVar148._8_4_;
            auVar104._0_8_ = auVar148._0_8_;
            auVar104._12_4_ = auVar148._12_4_;
          }
          uVar47 = movmskps(iVar44,auVar104);
          uVar56 = CONCAT44((int)((ulong)lVar50 >> 0x20),uVar47);
          lVar50 = 0;
          if (uVar56 != 0) {
            for (; (uVar56 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
            }
          }
          *(undefined4 *)(local_308 + lVar50 * 4) = 0;
          auVar23._4_4_ = fVar202;
          auVar23._0_4_ = fVar194;
          auVar23._8_4_ = fVar203;
          auVar23._12_4_ = fVar223;
          auVar21._4_4_ = fVar246;
          auVar21._0_4_ = fVar244;
          auVar21._8_4_ = fVar268;
          auVar21._12_4_ = fVar274;
          auVar291 = minps(auVar23,auVar21);
          auVar373 = maxps(auVar23,auVar21);
          auVar19._4_4_ = fVar310;
          auVar19._0_4_ = fVar304;
          auVar19._8_4_ = fVar313;
          auVar19._12_4_ = fVar318;
          auVar17._4_4_ = fVar249;
          auVar17._0_4_ = fVar255;
          auVar17._8_4_ = fVar253;
          auVar17._12_4_ = fVar323;
          auVar175 = minps(auVar19,auVar17);
          auVar291 = minps(auVar291,auVar175);
          auVar175 = maxps(auVar19,auVar17);
          auVar373 = maxps(auVar373,auVar175);
          auVar185._0_4_ = auVar291._0_4_ & auVar69._0_4_;
          auVar185._4_4_ = auVar291._4_4_ & auVar69._4_4_;
          auVar185._8_4_ = auVar291._8_4_ & auVar69._8_4_;
          auVar185._12_4_ = auVar291._12_4_ & auVar69._12_4_;
          auVar105._0_4_ = auVar373._0_4_ & auVar69._0_4_;
          auVar105._4_4_ = auVar373._4_4_ & auVar69._4_4_;
          auVar105._8_4_ = auVar373._8_4_ & auVar69._8_4_;
          auVar105._12_4_ = (uint)auVar373._12_4_ & auVar69._12_4_;
          auVar175 = maxps(auVar185,auVar105);
          fVar327 = auVar175._4_4_;
          if (auVar175._4_4_ <= auVar175._0_4_) {
            fVar327 = auVar175._0_4_;
          }
          auVar186._8_8_ = auVar175._8_8_;
          auVar186._0_8_ = auVar175._8_8_;
          if (auVar175._8_4_ <= fVar327) {
            auVar186._0_4_ = fVar327;
          }
          fVar360 = auVar186._0_4_ * 1.9073486e-06;
          fVar327 = local_118[lVar50];
          fVar345 = tp1.upper.field_0.v[lVar50];
          for (uVar56 = 0; uVar56 != 5; uVar56 = uVar56 + 1) {
            fVar362 = SQRT(fVar170) * 1.9073486e-06 * fVar345;
            fVar160 = 1.0 - fVar327;
            fVar221 = fVar327 * 3.0;
            fVar361 = -fVar327 * fVar160 * fVar160 * 0.5;
            fVar171 = (fVar327 * fVar327 * (fVar221 + -5.0) + 2.0) * 0.5;
            fVar169 = ((fVar160 * 3.0 + -5.0) * fVar160 * fVar160 + 2.0) * 0.5;
            fVar172 = -fVar160 * fVar327 * fVar327 * 0.5;
            local_588 = fVar361 * fVar194 +
                        fVar171 * fVar244 + fVar169 * fVar304 + fVar172 * fVar255;
            fStack_584 = fVar361 * fVar202 +
                         fVar171 * fVar246 + fVar169 * fVar310 + fVar172 * fVar249;
            fStack_580 = fVar361 * fVar203 +
                         fVar171 * fVar268 + fVar169 * fVar313 + fVar172 * fVar253;
            fStack_57c = fVar361 * fVar223 +
                         fVar171 * fVar274 + fVar169 * fVar318 + fVar172 * fVar323;
            fVar172 = (fVar327 * (fVar160 + fVar160) - fVar160 * fVar160) * 0.5;
            fVar171 = ((fVar327 + fVar327) * (fVar221 + -5.0) + fVar327 * fVar221) * 0.5;
            fVar169 = ((fVar221 + 2.0) * (fVar160 + fVar160) + fVar160 * -3.0 * fVar160) * 0.5;
            fVar361 = (fVar160 * -2.0 * fVar327 + fVar327 * fVar327) * 0.5;
            fVar300 = fVar172 * fVar194 + fVar171 * fVar244 + fVar169 * fVar304 + fVar361 * fVar255;
            fVar275 = fVar172 * fVar202 + fVar171 * fVar246 + fVar169 * fVar310 + fVar361 * fVar249;
            fVar302 = fVar172 * fVar203 + fVar171 * fVar268 + fVar169 * fVar313 + fVar361 * fVar253;
            fVar305 = fVar172 * fVar223 + fVar171 * fVar274 + fVar169 * fVar318 + fVar361 * fVar323;
            fVar160 = fVar327 * -3.0 + 2.0;
            fVar171 = fVar327 * 9.0 + -5.0;
            fVar361 = fVar327 * -9.0 + 4.0;
            fVar221 = fVar221 + -1.0;
            fVar169 = fVar160 * fVar194 + fVar171 * fVar244 + fVar361 * fVar304 + fVar221 * fVar255;
            fVar172 = fVar160 * fVar202 + fVar171 * fVar246 + fVar361 * fVar310 + fVar221 * fVar249;
            fVar287 = fVar160 * fVar203 + fVar171 * fVar268 + fVar361 * fVar313 + fVar221 * fVar253;
            fVar171 = (fVar345 * dir.field_0.m128[0] + 0.0) - local_588;
            fVar256 = (fVar345 * dir.field_0.m128[1] + 0.0) - fStack_584;
            fVar269 = (fVar345 * dir.field_0.m128[2] + 0.0) - fStack_580;
            fVar297 = (fVar345 * dir.field_0.m128[3] + 0.0) - fStack_57c;
            fVar361 = fVar256 * fVar256;
            fVar221 = fVar269 * fVar269;
            fVar160 = fVar297 * fVar297;
            auVar309._0_4_ = fVar361 + fVar171 * fVar171 + fVar221;
            auVar309._4_4_ = fVar361 + fVar361 + fVar160;
            auVar309._8_4_ = fVar361 + fVar221 + fVar221;
            auVar309._12_4_ = fVar361 + fVar160 + fVar160;
            fVar361 = fVar360;
            if (fVar360 <= fVar362) {
              fVar361 = fVar362;
            }
            fVar221 = fVar275 * fVar275 + fVar300 * fVar300 + fVar302 * fVar302;
            auVar175 = ZEXT416((uint)fVar221);
            auVar69 = rsqrtss(ZEXT416((uint)fVar221),auVar175);
            fVar362 = auVar69._0_4_;
            fVar160 = fVar362 * 1.5 - fVar362 * fVar362 * fVar221 * 0.5 * fVar362;
            fVar369 = fVar300 * fVar160;
            fVar374 = fVar275 * fVar160;
            fVar377 = fVar302 * fVar160;
            fVar380 = fVar305 * fVar160;
            fVar316 = fVar287 * fVar302 + fVar172 * fVar275 + fVar169 * fVar300;
            auVar69 = rcpss(auVar175,auVar175);
            fVar362 = (2.0 - fVar221 * auVar69._0_4_) * auVar69._0_4_;
            fVar280 = fVar256 * fVar374;
            fVar311 = fVar269 * fVar377;
            fVar314 = fVar297 * fVar380;
            fVar259 = fVar280 + fVar171 * fVar369 + fVar311;
            fVar220 = fVar280 + fVar280 + fVar314;
            fVar311 = fVar280 + fVar311 + fVar311;
            fVar314 = fVar280 + fVar314 + fVar314;
            fVar222 = (SQRT(auVar309._0_4_) + 1.0) * (fVar360 / SQRT(fVar221)) +
                      SQRT(auVar309._0_4_) * fVar360 + fVar361;
            fVar320 = dir.field_0.m128[3] * fVar380;
            fVar380 = fVar380 * -fVar305;
            fVar160 = fVar377 * -fVar302 + fVar374 * -fVar275 + fVar369 * -fVar300 +
                      fVar362 * (fVar221 * fVar287 - fVar316 * fVar302) * fVar160 * fVar269 +
                      fVar362 * (fVar221 * fVar172 - fVar316 * fVar275) * fVar160 * fVar256 +
                      fVar362 * (fVar221 * fVar169 - fVar316 * fVar300) * fVar160 * fVar171;
            fVar280 = dir.field_0.m128[2] * fVar377 +
                      dir.field_0.m128[1] * fVar374 + dir.field_0.m128[0] * fVar369;
            fVar362 = auVar309._0_4_ - fVar259 * fVar259;
            auVar106._0_8_ = CONCAT44(auVar309._4_4_ - fVar220 * fVar220,fVar362);
            auVar106._8_4_ = auVar309._8_4_ - fVar311 * fVar311;
            auVar106._12_4_ = auVar309._12_4_ - fVar314 * fVar314;
            fVar311 = -fVar305 * fVar297;
            local_678 = CONCAT44(fVar380,fVar160);
            fVar169 = dir.field_0.m128[0] * fVar171;
            fVar172 = dir.field_0.m128[1] * fVar256;
            fVar287 = dir.field_0.m128[2] * fVar269;
            fVar297 = dir.field_0.m128[3] * fVar297;
            auVar149._8_4_ = auVar106._8_4_;
            auVar149._0_8_ = auVar106._0_8_;
            auVar149._12_4_ = auVar106._12_4_;
            auVar69 = rsqrtss(auVar149,auVar106);
            fVar221 = auVar69._0_4_;
            fVar221 = fVar221 * 1.5 - fVar221 * fVar221 * fVar362 * 0.5 * fVar221;
            if (fVar362 < 0.0) {
              fVar362 = sqrtf(fVar362);
              lVar50 = extraout_RAX_00;
              _Var53 = extraout_RDX_01;
            }
            else {
              fVar362 = SQRT(fVar362);
            }
            fVar362 = fVar362 - fStack_57c;
            fVar314 = ((-fVar302 * fVar269 + -fVar275 * fVar256 + -fVar300 * fVar171) -
                      fVar259 * fVar160) * fVar221 - fVar305;
            fVar221 = ((fVar287 + fVar172 + fVar169) - fVar259 * fVar280) * fVar221;
            auVar368._0_8_ = CONCAT44(fVar311,fVar314) ^ 0x8000000080000000;
            auVar187._0_4_ = fVar160 * fVar221 - fVar280 * fVar314;
            auVar368._8_4_ = -fVar311;
            auVar368._12_4_ = fVar297;
            auVar367._8_8_ = auVar368._8_8_;
            auVar367._0_8_ = CONCAT44(fVar221,fVar314) ^ 0x80000000;
            auVar187._4_4_ = auVar187._0_4_;
            auVar187._8_4_ = auVar187._0_4_;
            auVar187._12_4_ = auVar187._0_4_;
            auVar175 = divps(auVar367,auVar187);
            auVar214._8_4_ = fVar380;
            auVar214._0_8_ = local_678;
            auVar214._12_4_ = -fVar320;
            auVar213._8_8_ = auVar214._8_8_;
            auVar213._0_8_ = CONCAT44(fVar280,fVar160) ^ 0x8000000000000000;
            auVar69 = divps(auVar213,auVar187);
            fVar345 = fVar345 - (fVar362 * auVar69._0_4_ + fVar259 * auVar175._0_4_);
            fVar327 = fVar327 - (fVar362 * auVar69._4_4_ + fVar259 * auVar175._4_4_);
            auVar69 = _DAT_01f46710;
            if (((float)((uint)fVar259 & (uint)DAT_01f46710) < fVar222) &&
               ((float)((uint)fVar362 & (uint)DAT_01f46710) <
                auVar373._12_4_ * 1.9073486e-06 + fVar361 + fVar222)) {
              bVar60 = uVar56 < 5;
              fVar345 = fVar254 + fVar345;
              if ((fVar345 < fVar158) ||
                 (fVar360 = *(float *)(ray + k * 4 + 0x80), fVar360 < fVar345)) {
                lVar50 = 0;
              }
              else {
                lVar50 = 0;
                if ((0.0 <= fVar327) && (fVar327 <= 1.0)) {
                  auVar175 = rsqrtss(auVar309,auVar309);
                  fVar361 = auVar175._0_4_;
                  pGVar9 = (context->scene->geometries).items[local_5d0].ptr;
                  _Var53 = local_5d0;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    lVar50 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (lVar50 = CONCAT71((int7)((ulong)context->args >> 8),1),
                          pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar361 = fVar361 * 1.5 + fVar361 * fVar361 * auVar309._0_4_ * -0.5 * fVar361;
                    fVar171 = fVar171 * fVar361;
                    fVar256 = fVar256 * fVar361;
                    fVar269 = fVar269 * fVar361;
                    fVar361 = fVar305 * fVar171 + fVar300;
                    fVar362 = fVar305 * fVar256 + fVar275;
                    fVar221 = fVar305 * fVar269 + fVar302;
                    fVar160 = fVar256 * fVar300 - fVar275 * fVar171;
                    fVar169 = fVar269 * fVar275 - fVar302 * fVar256;
                    fVar171 = fVar171 * fVar302 - fVar300 * fVar269;
                    local_2c8 = fVar169 * fVar362 - fVar171 * fVar361;
                    local_2e8._4_4_ = fVar171 * fVar221 - fVar160 * fVar362;
                    local_2d8 = fVar160 * fVar361 - fVar169 * fVar221;
                    local_2e8._0_4_ = local_2e8._4_4_;
                    fStack_2e0 = (float)local_2e8._4_4_;
                    fStack_2dc = (float)local_2e8._4_4_;
                    fStack_2d4 = local_2d8;
                    fStack_2d0 = local_2d8;
                    fStack_2cc = local_2d8;
                    fStack_2c4 = local_2c8;
                    fStack_2c0 = local_2c8;
                    fStack_2bc = local_2c8;
                    local_2b8 = fVar327;
                    fStack_2b4 = fVar327;
                    fStack_2b0 = fVar327;
                    fStack_2ac = fVar327;
                    local_2a8 = 0;
                    uStack_2a4 = 0;
                    uStack_2a0 = 0;
                    uStack_29c = 0;
                    local_298 = CONCAT44(uVar62,uVar62);
                    uStack_290 = CONCAT44(uVar62,uVar62);
                    local_288 = CONCAT44(uVar61,uVar61);
                    uStack_280 = CONCAT44(uVar61,uVar61);
                    local_278 = context->user->instID[0];
                    uStack_274 = local_278;
                    uStack_270 = local_278;
                    uStack_26c = local_278;
                    local_268 = context->user->instPrimID[0];
                    uStack_264 = local_268;
                    uStack_260 = local_268;
                    uStack_25c = local_268;
                    *(float *)(ray + k * 4 + 0x80) = fVar345;
                    local_5e8 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                    args.valid = (int *)local_5e8;
                    args.geometryUserPtr = pGVar9->userPtr;
                    args.context = context->user;
                    args.ray = (RTCRayN *)ray;
                    args.hit = (RTCHitN *)local_2e8;
                    args.N = 4;
                    p_Var10 = pGVar9->occlusionFilterN;
                    auVar383._8_8_ = &local_278;
                    auVar383._0_8_ = p_Var10;
                    if (p_Var10 != (RTCFilterFunctionN)0x0) {
                      auVar383 = (*p_Var10)(&args);
                    }
                    _Var53 = auVar383._8_8_;
                    auVar150._0_4_ = -(uint)(local_5e8._0_4_ == 0);
                    auVar150._4_4_ = -(uint)(local_5e8._4_4_ == 0);
                    auVar150._8_4_ = -(uint)(local_5e8._8_4_ == 0);
                    auVar150._12_4_ = -(uint)(local_5e8._12_4_ == 0);
                    uVar115 = movmskps(auVar383._0_4_,auVar150);
                    pRVar49 = (RTCRayN *)(ulong)(uVar115 ^ 0xf);
                    if ((uVar115 ^ 0xf) == 0) {
                      auVar150 = auVar150 ^ _DAT_01f46b70;
                      auVar69 = _DAT_01f46710;
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var10)(&args);
                        _Var53 = extraout_RDX_02;
                      }
                      auVar69 = _DAT_01f46710;
                      auVar107._0_4_ = -(uint)(local_5e8._0_4_ == 0);
                      auVar107._4_4_ = -(uint)(local_5e8._4_4_ == 0);
                      auVar107._8_4_ = -(uint)(local_5e8._8_4_ == 0);
                      auVar107._12_4_ = -(uint)(local_5e8._12_4_ == 0);
                      auVar150 = auVar107 ^ _DAT_01f46b70;
                      *(undefined1 (*) [16])(args.ray + 0x80) =
                           ~auVar107 & _DAT_01f45a40 |
                           *(undefined1 (*) [16])(args.ray + 0x80) & auVar107;
                      pRVar49 = args.ray;
                    }
                    auVar151._0_4_ = auVar150._0_4_ << 0x1f;
                    auVar151._4_4_ = auVar150._4_4_ << 0x1f;
                    auVar151._8_4_ = auVar150._8_4_ << 0x1f;
                    auVar151._12_4_ = auVar150._12_4_ << 0x1f;
                    iVar44 = movmskps((int)pRVar49,auVar151);
                    lVar50 = CONCAT71((int7)(CONCAT44((int)((ulong)pRVar49 >> 0x20),iVar44) >> 8),
                                      iVar44 != 0);
                    if (iVar44 == 0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar360;
                    }
                  }
                }
              }
              goto LAB_002ffbad;
            }
          }
          bVar60 = false;
LAB_002ffbad:
          bVar54 = bVar54 | bVar60 & (byte)lVar50;
          fVar345 = *(float *)(ray + k * 4 + 0x80);
          auVar104._0_4_ = -(uint)(local_5a8 <= fVar345) & local_308._0_4_;
          auVar104._4_4_ = -(uint)(fStack_5a4 <= fVar345) & local_308._4_4_;
          auVar104._8_4_ = -(uint)(fStack_5a0 <= fVar345) & local_308._8_4_;
          auVar104._12_4_ = -(uint)(fStack_59c <= fVar345) & local_308._12_4_;
        }
        auVar215._0_4_ = local_5c8._0_4_ & uVar63 & -(uint)(fVar254 + fVar334 <= fVar345);
        auVar215._4_4_ = local_5c8._4_4_ & uVar64 & -(uint)(fVar254 + fVar349 <= fVar345);
        auVar215._8_4_ = (uint)fStack_5c0 & uVar66 & -(uint)(fVar254 + fVar352 <= fVar345);
        auVar215._12_4_ = (uint)fStack_5bc & uVar112 & -(uint)(fVar254 + fVar356 <= fVar345);
        auVar188._0_4_ =
             auVar103._0_4_ & auVar165._0_4_ & -(uint)(fVar254 + tp1.lower.field_0.v[0] <= fVar345);
        auVar188._4_4_ =
             auVar103._4_4_ & auVar165._4_4_ & -(uint)(fVar254 + tp1.lower.field_0.v[1] <= fVar345);
        auVar188._8_4_ =
             auVar103._8_4_ & auVar165._8_4_ & -(uint)(fVar254 + tp1.lower.field_0.v[2] <= fVar345);
        auVar188._12_4_ =
             auVar103._12_4_ & auVar165._12_4_ &
             -(uint)(fVar254 + tp1.lower.field_0.v[3] <= fVar345);
        uVar63 = movmskps(0,auVar188 | auVar215);
        uVar56 = (ulong)uVar63;
        if (uVar63 != 0) {
          uVar56 = _Var52 * 0x30;
          stack[_Var52].valid.field_0 =
               (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar188 | auVar215);
          auVar108._0_4_ = (uint)fVar334 & auVar215._0_4_;
          auVar108._4_4_ = (uint)fVar349 & auVar215._4_4_;
          auVar108._8_4_ = (uint)fVar352 & auVar215._8_4_;
          auVar108._12_4_ = (uint)fVar356 & auVar215._12_4_;
          auVar216._0_4_ = ~auVar215._0_4_ & tp1.lower.field_0.i[0];
          auVar216._4_4_ = ~auVar215._4_4_ & tp1.lower.field_0.i[1];
          auVar216._8_4_ = ~auVar215._8_4_ & tp1.lower.field_0.i[2];
          auVar216._12_4_ = ~auVar215._12_4_ & tp1.lower.field_0.i[3];
          stack[_Var52].tlower.field_0 =
               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar216 | auVar108);
          stack[_Var52].u0 = (float)local_438._4_4_;
          stack[_Var52].u1 = fVar168;
          stack[_Var52].depth = local_6bc + 1;
          _Var52 = (ulong)((int)_Var52 + 1);
        }
      }
    }
    do {
      _Var59 = _Var52;
      iVar44 = (int)_Var59;
      if (iVar44 == 0) {
        if (bVar54 != 0) goto LAB_003001da;
        fVar120 = *(float *)(ray + k * 4 + 0x80);
        auVar155._4_4_ = -(uint)(fVar65 <= fVar120);
        auVar155._0_4_ = -(uint)(fVar193 <= fVar120);
        auVar155._8_4_ = -(uint)(fVar111 <= fVar120);
        auVar155._12_4_ = -(uint)(fVar114 <= fVar120);
        uVar61 = movmskps((int)uVar56,auVar155);
        uVar61 = (uint)uVar57 & uVar61;
        goto LAB_002fd742;
      }
      _Var52 = (__int_type_conflict)(iVar44 - 1U);
      uVar56 = _Var52 * 0x30;
      fVar327 = stack[_Var52].tlower.field_0.v[0];
      fVar334 = stack[_Var52].tlower.field_0.v[1];
      fVar345 = stack[_Var52].tlower.field_0.v[2];
      fVar349 = stack[_Var52].tlower.field_0.v[3];
      fVar168 = *(float *)(ray + k * 4 + 0x80);
      aVar109._0_4_ = -(uint)(fVar254 + fVar327 <= fVar168) & stack[_Var52].valid.field_0.i[0];
      aVar109._4_4_ = -(uint)(fVar254 + fVar334 <= fVar168) & stack[_Var52].valid.field_0.i[1];
      aVar109.i[2] = -(uint)(fVar254 + fVar345 <= fVar168) & stack[_Var52].valid.field_0.i[2];
      aVar109.i[3] = -(uint)(fVar254 + fVar349 <= fVar168) & stack[_Var52].valid.field_0.i[3];
      _local_2e8 = aVar109;
      uVar63 = movmskps((int)_Var53,(undefined1  [16])aVar109);
      _Var53 = (__int_type_conflict)uVar63;
    } while (uVar63 == 0);
    auVar152._0_4_ = (uint)fVar327 & aVar109._0_4_;
    auVar152._4_4_ = (uint)fVar334 & aVar109._4_4_;
    auVar152._8_4_ = (uint)fVar345 & aVar109.i[2];
    auVar152._12_4_ = (uint)fVar349 & aVar109.i[3];
    auVar166._0_8_ = CONCAT44(~aVar109._4_4_,~aVar109._0_4_) & 0x7f8000007f800000;
    auVar166._8_4_ = ~aVar109.i[2] & 0x7f800000;
    auVar166._12_4_ = ~aVar109.i[3] & 0x7f800000;
    auVar166 = auVar166 | auVar152;
    auVar189._4_4_ = auVar166._0_4_;
    auVar189._0_4_ = auVar166._4_4_;
    auVar189._8_4_ = auVar166._12_4_;
    auVar189._12_4_ = auVar166._8_4_;
    auVar69 = minps(auVar189,auVar166);
    auVar153._0_8_ = auVar69._8_8_;
    auVar153._8_4_ = auVar69._0_4_;
    auVar153._12_4_ = auVar69._4_4_;
    auVar69 = minps(auVar153,auVar69);
    auVar154._0_8_ =
         CONCAT44(-(uint)(auVar69._4_4_ == auVar166._4_4_) & aVar109._4_4_,
                  -(uint)(auVar69._0_4_ == auVar166._0_4_) & aVar109._0_4_);
    auVar154._8_4_ = -(uint)(auVar69._8_4_ == auVar166._8_4_) & aVar109.i[2];
    auVar154._12_4_ = -(uint)(auVar69._12_4_ == auVar166._12_4_) & aVar109.i[3];
    iVar51 = movmskps(iVar44 - 1U,auVar154);
    if (iVar51 != 0) {
      aVar109.i[2] = auVar154._8_4_;
      aVar109._0_8_ = auVar154._0_8_;
      aVar109.i[3] = auVar154._12_4_;
    }
    pSVar48 = stack + _Var52;
    uVar63 = movmskps(iVar51,(undefined1  [16])aVar109);
    lVar50 = 0;
    if (uVar63 != 0) {
      for (; (uVar63 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
      }
    }
    *(undefined4 *)(local_2e8 + lVar50 * 4) = 0;
    uVar6 = stack[_Var52].u0;
    uVar7 = stack[_Var52].u1;
    local_6bc = stack[_Var52].depth;
    iVar51 = movmskps(local_6bc,(undefined1  [16])_local_2e8);
    _Var53 = (ulong)(iVar44 - 1);
    if (iVar51 != 0) {
      _Var53 = _Var59;
    }
    (pSVar48->valid).field_0 = _local_2e8;
    fVar168 = (float)uVar7 - (float)uVar6;
    args.valid = (int *)CONCAT44(fVar168 * 0.33333334 + (float)uVar6,fVar168 * 0.0 + (float)uVar6);
    args.geometryUserPtr =
         (void *)CONCAT44(fVar168 * 1.0 + (float)uVar6,fVar168 * 0.6666667 + (float)uVar6);
    local_438._4_4_ = *(float *)((long)&args.valid + lVar50 * 4);
    fVar168 = *(float *)((long)&args.valid + lVar50 * 4 + 4);
    _Var52 = _Var53;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }